

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [60];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar83 [16];
  uint uVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar76 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [64];
  float t1;
  undefined4 uVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vfloat4 b0;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vfloat4 b0_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vfloat4 a0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar227;
  float fVar228;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar240;
  float fVar241;
  vfloat4 a0_1;
  undefined1 auVar230 [16];
  float fVar242;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  float fVar250;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  uint auStack_5e0 [4];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar54;
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar255 [32];
  
  PVar5 = prim[1];
  uVar59 = (ulong)(byte)PVar5;
  fVar141 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar67 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar133 = vsubps_avx(auVar65,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  fVar140 = fVar141 * auVar133._0_4_;
  fVar123 = fVar141 * auVar67._0_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar59 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar65);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar59 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar75);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar59 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar3);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar74);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar99 = vpmovsxbd_avx2(auVar73);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar99);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar59 + 6);
  auVar93 = vpmovsxbd_avx2(auVar72);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar58 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar58 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar58 + uVar59 + 6);
  auVar97 = vpmovsxbd_avx2(auVar71);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar53 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar53 + 6);
  auVar91 = vpmovsxbd_avx2(auVar4);
  auVar98 = vcvtdq2ps_avx(auVar91);
  auVar165._4_4_ = fVar123;
  auVar165._0_4_ = fVar123;
  auVar165._8_4_ = fVar123;
  auVar165._12_4_ = fVar123;
  auVar165._16_4_ = fVar123;
  auVar165._20_4_ = fVar123;
  auVar165._24_4_ = fVar123;
  auVar165._28_4_ = fVar123;
  auVar261._8_4_ = 1;
  auVar261._0_8_ = 0x100000001;
  auVar261._12_4_ = 1;
  auVar261._16_4_ = 1;
  auVar261._20_4_ = 1;
  auVar261._24_4_ = 1;
  auVar261._28_4_ = 1;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = ZEXT1632(CONCAT412(fVar141 * auVar67._12_4_,
                                CONCAT48(fVar141 * auVar67._8_4_,
                                         CONCAT44(fVar141 * auVar67._4_4_,fVar123))));
  auVar100 = vpermps_avx2(auVar261,auVar101);
  auVar90 = vpermps_avx512vl(auVar89,auVar101);
  fVar123 = auVar90._0_4_;
  fVar218 = auVar90._4_4_;
  auVar101._4_4_ = fVar218 * auVar95._4_4_;
  auVar101._0_4_ = fVar123 * auVar95._0_4_;
  fVar227 = auVar90._8_4_;
  auVar101._8_4_ = fVar227 * auVar95._8_4_;
  fVar228 = auVar90._12_4_;
  auVar101._12_4_ = fVar228 * auVar95._12_4_;
  fVar129 = auVar90._16_4_;
  auVar101._16_4_ = fVar129 * auVar95._16_4_;
  fVar130 = auVar90._20_4_;
  auVar101._20_4_ = fVar130 * auVar95._20_4_;
  fVar131 = auVar90._24_4_;
  auVar101._24_4_ = fVar131 * auVar95._24_4_;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar93._4_4_ * fVar218;
  auVar99._0_4_ = auVar93._0_4_ * fVar123;
  auVar99._8_4_ = auVar93._8_4_ * fVar227;
  auVar99._12_4_ = auVar93._12_4_ * fVar228;
  auVar99._16_4_ = auVar93._16_4_ * fVar129;
  auVar99._20_4_ = auVar93._20_4_ * fVar130;
  auVar99._24_4_ = auVar93._24_4_ * fVar131;
  auVar99._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar98._4_4_ * fVar218;
  auVar91._0_4_ = auVar98._0_4_ * fVar123;
  auVar91._8_4_ = auVar98._8_4_ * fVar227;
  auVar91._12_4_ = auVar98._12_4_ * fVar228;
  auVar91._16_4_ = auVar98._16_4_ * fVar129;
  auVar91._20_4_ = auVar98._20_4_ * fVar130;
  auVar91._24_4_ = auVar98._24_4_ * fVar131;
  auVar91._28_4_ = auVar90._28_4_;
  auVar65 = vfmadd231ps_fma(auVar101,auVar100,auVar92);
  auVar75 = vfmadd231ps_fma(auVar99,auVar100,auVar106);
  auVar3 = vfmadd231ps_fma(auVar91,auVar97,auVar100);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar165,auVar94);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar165,auVar105);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar96,auVar165);
  auVar247._4_4_ = fVar140;
  auVar247._0_4_ = fVar140;
  auVar247._8_4_ = fVar140;
  auVar247._12_4_ = fVar140;
  auVar247._16_4_ = fVar140;
  auVar247._20_4_ = fVar140;
  auVar247._24_4_ = fVar140;
  auVar247._28_4_ = fVar140;
  auVar91 = ZEXT1632(CONCAT412(fVar141 * auVar133._12_4_,
                               CONCAT48(fVar141 * auVar133._8_4_,
                                        CONCAT44(fVar141 * auVar133._4_4_,fVar140))));
  auVar99 = vpermps_avx2(auVar261,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  fVar141 = auVar91._0_4_;
  fVar123 = auVar91._4_4_;
  auVar100._4_4_ = fVar123 * auVar95._4_4_;
  auVar100._0_4_ = fVar141 * auVar95._0_4_;
  fVar218 = auVar91._8_4_;
  auVar100._8_4_ = fVar218 * auVar95._8_4_;
  fVar227 = auVar91._12_4_;
  auVar100._12_4_ = fVar227 * auVar95._12_4_;
  fVar228 = auVar91._16_4_;
  auVar100._16_4_ = fVar228 * auVar95._16_4_;
  fVar129 = auVar91._20_4_;
  auVar100._20_4_ = fVar129 * auVar95._20_4_;
  fVar130 = auVar91._24_4_;
  auVar100._24_4_ = fVar130 * auVar95._24_4_;
  auVar100._28_4_ = 1;
  auVar89._4_4_ = auVar93._4_4_ * fVar123;
  auVar89._0_4_ = auVar93._0_4_ * fVar141;
  auVar89._8_4_ = auVar93._8_4_ * fVar218;
  auVar89._12_4_ = auVar93._12_4_ * fVar227;
  auVar89._16_4_ = auVar93._16_4_ * fVar228;
  auVar89._20_4_ = auVar93._20_4_ * fVar129;
  auVar89._24_4_ = auVar93._24_4_ * fVar130;
  auVar89._28_4_ = auVar95._28_4_;
  auVar93._4_4_ = auVar98._4_4_ * fVar123;
  auVar93._0_4_ = auVar98._0_4_ * fVar141;
  auVar93._8_4_ = auVar98._8_4_ * fVar218;
  auVar93._12_4_ = auVar98._12_4_ * fVar227;
  auVar93._16_4_ = auVar98._16_4_ * fVar228;
  auVar93._20_4_ = auVar98._20_4_ * fVar129;
  auVar93._24_4_ = auVar98._24_4_ * fVar130;
  auVar93._28_4_ = auVar91._28_4_;
  auVar74 = vfmadd231ps_fma(auVar100,auVar99,auVar92);
  auVar73 = vfmadd231ps_fma(auVar89,auVar99,auVar106);
  auVar72 = vfmadd231ps_fma(auVar93,auVar99,auVar97);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar247,auVar94);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar247,auVar105);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar247,auVar96);
  auVar94 = vandps_avx(ZEXT1632(auVar65),auVar108);
  auVar153._8_4_ = 0x219392ef;
  auVar153._0_8_ = 0x219392ef219392ef;
  auVar153._12_4_ = 0x219392ef;
  auVar153._16_4_ = 0x219392ef;
  auVar153._20_4_ = 0x219392ef;
  auVar153._24_4_ = 0x219392ef;
  auVar153._28_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar94,auVar153,1);
  bVar63 = (bool)((byte)uVar58 & 1);
  auVar90._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._0_4_;
  bVar63 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._4_4_;
  bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._8_4_;
  bVar63 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar65._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar75),auVar108);
  uVar58 = vcmpps_avx512vl(auVar94,auVar153,1);
  bVar63 = (bool)((byte)uVar58 & 1);
  auVar102._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar75._0_4_;
  bVar63 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar75._4_4_;
  bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar75._8_4_;
  bVar63 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar75._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar3),auVar108);
  uVar58 = vcmpps_avx512vl(auVar94,auVar153,1);
  bVar63 = (bool)((byte)uVar58 & 1);
  auVar94._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar3._0_4_;
  bVar63 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar3._4_4_;
  bVar63 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar3._8_4_;
  bVar63 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar3._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar65 = vfnmadd213ps_fma(auVar90,auVar92,auVar109);
  auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar102);
  auVar75 = vfnmadd213ps_fma(auVar102,auVar92,auVar109);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar3 = vfnmadd213ps_fma(auVar94,auVar92,auVar109);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar92,auVar92);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar74));
  auVar96._4_4_ = auVar65._4_4_ * auVar94._4_4_;
  auVar96._0_4_ = auVar65._0_4_ * auVar94._0_4_;
  auVar96._8_4_ = auVar65._8_4_ * auVar94._8_4_;
  auVar96._12_4_ = auVar65._12_4_ * auVar94._12_4_;
  auVar96._16_4_ = auVar94._16_4_ * 0.0;
  auVar96._20_4_ = auVar94._20_4_ * 0.0;
  auVar96._24_4_ = auVar94._24_4_ * 0.0;
  auVar96._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar74));
  auVar93 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar107._0_4_ = auVar65._0_4_ * auVar94._0_4_;
  auVar107._4_4_ = auVar65._4_4_ * auVar94._4_4_;
  auVar107._8_4_ = auVar65._8_4_ * auVar94._8_4_;
  auVar107._12_4_ = auVar65._12_4_ * auVar94._12_4_;
  auVar107._16_4_ = auVar94._16_4_ * 0.0;
  auVar107._20_4_ = auVar94._20_4_ * 0.0;
  auVar107._24_4_ = auVar94._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar59 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar73));
  auVar97._4_4_ = auVar75._4_4_ * auVar94._4_4_;
  auVar97._0_4_ = auVar75._0_4_ * auVar94._0_4_;
  auVar97._8_4_ = auVar75._8_4_ * auVar94._8_4_;
  auVar97._12_4_ = auVar75._12_4_ * auVar94._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar92);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar73));
  auVar104._0_4_ = auVar75._0_4_ * auVar94._0_4_;
  auVar104._4_4_ = auVar75._4_4_ * auVar94._4_4_;
  auVar104._8_4_ = auVar75._8_4_ * auVar94._8_4_;
  auVar104._12_4_ = auVar75._12_4_ * auVar94._12_4_;
  auVar104._16_4_ = auVar94._16_4_ * 0.0;
  auVar104._20_4_ = auVar94._20_4_ * 0.0;
  auVar104._24_4_ = auVar94._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 + uVar59 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar72));
  auVar98._4_4_ = auVar94._4_4_ * auVar3._4_4_;
  auVar98._0_4_ = auVar94._0_4_ * auVar3._0_4_;
  auVar98._8_4_ = auVar94._8_4_ * auVar3._8_4_;
  auVar98._12_4_ = auVar94._12_4_ * auVar3._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar72));
  auVar103._0_4_ = auVar3._0_4_ * auVar94._0_4_;
  auVar103._4_4_ = auVar3._4_4_ * auVar94._4_4_;
  auVar103._8_4_ = auVar3._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar3._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar96,auVar107);
  auVar92 = vpminsd_avx2(auVar97,auVar104);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92 = vpminsd_avx2(auVar98,auVar103);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar95._4_4_ = uVar132;
  auVar95._0_4_ = uVar132;
  auVar95._8_4_ = uVar132;
  auVar95._12_4_ = uVar132;
  auVar95._16_4_ = uVar132;
  auVar95._20_4_ = uVar132;
  auVar95._24_4_ = uVar132;
  auVar95._28_4_ = uVar132;
  auVar92 = vmaxps_avx512vl(auVar92,auVar95);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar94,auVar92);
  auVar94 = vpmaxsd_avx2(auVar96,auVar107);
  auVar92 = vpmaxsd_avx2(auVar97,auVar104);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar92 = vpmaxsd_avx2(auVar98,auVar103);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar105._4_4_ = uVar132;
  auVar105._0_4_ = uVar132;
  auVar105._8_4_ = uVar132;
  auVar105._12_4_ = uVar132;
  auVar105._16_4_ = uVar132;
  auVar105._20_4_ = uVar132;
  auVar105._24_4_ = uVar132;
  auVar105._28_4_ = uVar132;
  auVar92 = vminps_avx512vl(auVar92,auVar105);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar106);
  uVar24 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar23 = vcmpps_avx512vl(local_3c0,auVar94,2);
  if ((byte)((byte)uVar23 & (byte)uVar24) != 0) {
    uVar58 = (ulong)(byte)((byte)uVar23 & (byte)uVar24);
    auVar128 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar128);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar128 = ZEXT1664(auVar65);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar262 = ZEXT1664(auVar65);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar263 = ZEXT1664(auVar65);
    auVar270 = ZEXT464(0x3f800000);
    do {
      lVar55 = 0;
      for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        lVar55 = lVar55 + 1;
      }
      uVar60 = *(uint *)(prim + 2);
      uVar6 = *(uint *)(prim + lVar55 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[uVar60].ptr;
      uVar53 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar6);
      p_Var9 = pGVar8[1].intersectionFilterN;
      pvVar10 = pGVar8[2].userPtr;
      _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar65 = *(undefined1 (*) [16])(_Var11 + uVar53 * (long)pvVar10);
      auVar75 = *(undefined1 (*) [16])(_Var11 + (uVar53 + 1) * (long)pvVar10);
      auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar53 + 2) * (long)pvVar10);
      auVar74 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar53 + 3));
      lVar55 = *(long *)&pGVar8[1].time_range.upper;
      auVar73 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * uVar53);
      auVar72 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 1));
      auVar83 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 2));
      uVar58 = uVar58 - 1 & uVar58;
      auVar71 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 3));
      if (uVar58 != 0) {
        uVar59 = uVar58 - 1 & uVar58;
        for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        }
        if (uVar59 != 0) {
          for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar141 = *(float *)(ray + k * 4 + 0xc0);
      auVar76 = ZEXT816(0) << 0x40;
      auVar69._0_4_ = auVar71._0_4_ * 0.0;
      auVar69._4_4_ = auVar71._4_4_ * 0.0;
      auVar69._8_4_ = auVar71._8_4_ * 0.0;
      auVar69._12_4_ = auVar71._12_4_ * 0.0;
      auVar251._8_4_ = 0x3e2aaaab;
      auVar251._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar251._12_4_ = 0x3e2aaaab;
      auVar67 = vfmadd213ps_fma(auVar251,auVar83,auVar69);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar66);
      auVar133 = vfmadd231ps_fma(auVar67,auVar73,auVar251);
      auVar77 = auVar128._0_16_;
      auVar67 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar77);
      auVar67 = vfnmadd231ps_fma(auVar67,auVar72,auVar76);
      auVar68 = vfnmadd231ps_avx512vl(auVar67,auVar73,auVar77);
      auVar230._0_4_ = auVar74._0_4_ * 0.0;
      auVar230._4_4_ = auVar74._4_4_ * 0.0;
      auVar230._8_4_ = auVar74._8_4_ * 0.0;
      auVar230._12_4_ = auVar74._12_4_ * 0.0;
      auVar67 = vfmadd213ps_fma(auVar251,auVar3,auVar230);
      auVar67 = vfmadd231ps_avx512vl(auVar67,auVar75,auVar66);
      auVar67 = vfmadd231ps_fma(auVar67,auVar65,auVar251);
      auVar69 = vfmadd231ps_avx512vl(auVar230,auVar3,auVar77);
      auVar69 = vfnmadd231ps_fma(auVar69,auVar75,auVar76);
      auVar70 = vfnmadd231ps_avx512vl(auVar69,auVar65,auVar77);
      auVar86._0_4_ = auVar71._0_4_ * 0.16666667;
      auVar86._4_4_ = auVar71._4_4_ * 0.16666667;
      auVar86._8_4_ = auVar71._8_4_ * 0.16666667;
      auVar86._12_4_ = auVar71._12_4_ * 0.16666667;
      auVar69 = vfmadd231ps_avx512vl(auVar86,auVar83,auVar66);
      auVar69 = vfmadd231ps_fma(auVar69,auVar72,auVar251);
      auVar69 = vfmadd231ps_fma(auVar69,auVar73,auVar76);
      auVar71 = vmulps_avx512vl(auVar71,auVar77);
      auVar83 = vfmadd231ps_fma(auVar71,auVar76,auVar83);
      auVar72 = vfnmadd231ps_avx512vl(auVar83,auVar77,auVar72);
      auVar83 = vfnmadd231ps_fma(auVar72,auVar76,auVar73);
      auVar199._0_4_ = auVar74._0_4_ * 0.16666667;
      auVar199._4_4_ = auVar74._4_4_ * 0.16666667;
      auVar199._8_4_ = auVar74._8_4_ * 0.16666667;
      auVar199._12_4_ = auVar74._12_4_ * 0.16666667;
      auVar73 = vfmadd231ps_avx512vl(auVar199,auVar3,auVar66);
      auVar73 = vfmadd231ps_fma(auVar73,auVar75,auVar251);
      auVar73 = vfmadd231ps_fma(auVar73,auVar65,auVar76);
      auVar74 = vmulps_avx512vl(auVar74,auVar77);
      auVar3 = vfmadd231ps_fma(auVar74,auVar76,auVar3);
      auVar75 = vfnmadd231ps_avx512vl(auVar3,auVar77,auVar75);
      auVar72 = vfnmadd231ps_fma(auVar75,auVar76,auVar65);
      auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
      auVar75 = vshufps_avx(auVar67,auVar67,0xc9);
      fVar129 = auVar68._0_4_;
      auVar168._0_4_ = fVar129 * auVar75._0_4_;
      fVar130 = auVar68._4_4_;
      auVar168._4_4_ = fVar130 * auVar75._4_4_;
      fVar131 = auVar68._8_4_;
      auVar168._8_4_ = fVar131 * auVar75._8_4_;
      fVar140 = auVar68._12_4_;
      auVar168._12_4_ = fVar140 * auVar75._12_4_;
      auVar75 = vfmsub231ps_fma(auVar168,auVar65,auVar67);
      auVar3 = vshufps_avx(auVar75,auVar75,0xc9);
      auVar75 = vshufps_avx(auVar70,auVar70,0xc9);
      auVar79._0_4_ = fVar129 * auVar75._0_4_;
      auVar79._4_4_ = fVar130 * auVar75._4_4_;
      auVar79._8_4_ = fVar131 * auVar75._8_4_;
      auVar79._12_4_ = fVar140 * auVar75._12_4_;
      auVar65 = vfmsub231ps_fma(auVar79,auVar65,auVar70);
      auVar74 = vshufps_avx(auVar65,auVar65,0xc9);
      auVar65 = vshufps_avx(auVar83,auVar83,0xc9);
      auVar75 = vshufps_avx(auVar73,auVar73,0xc9);
      fVar149 = auVar83._0_4_;
      auVar84._0_4_ = fVar149 * auVar75._0_4_;
      fVar155 = auVar83._4_4_;
      auVar84._4_4_ = fVar155 * auVar75._4_4_;
      fVar156 = auVar83._8_4_;
      auVar84._8_4_ = fVar156 * auVar75._8_4_;
      fVar157 = auVar83._12_4_;
      auVar84._12_4_ = fVar157 * auVar75._12_4_;
      auVar75 = vfmsub231ps_fma(auVar84,auVar65,auVar73);
      auVar73 = vshufps_avx(auVar75,auVar75,0xc9);
      auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar200._0_4_ = auVar75._0_4_ * fVar149;
      auVar200._4_4_ = auVar75._4_4_ * fVar155;
      auVar200._8_4_ = auVar75._8_4_ * fVar156;
      auVar200._12_4_ = auVar75._12_4_ * fVar157;
      auVar75 = vfmsub231ps_fma(auVar200,auVar65,auVar72);
      auVar65 = vdpps_avx(auVar3,auVar3,0x7f);
      auVar72 = vshufps_avx(auVar75,auVar75,0xc9);
      fVar218 = auVar65._0_4_;
      auVar201._4_12_ = ZEXT812(0) << 0x20;
      auVar201._0_4_ = fVar218;
      auVar75 = vrsqrt14ss_avx512f(auVar76,auVar201);
      auVar71 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
      auVar67 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
      fVar123 = auVar75._0_4_;
      auVar75 = vdpps_avx(auVar3,auVar74,0x7f);
      fVar123 = auVar71._0_4_ + auVar67._0_4_ * fVar123 * fVar123 * fVar123;
      fVar229 = fVar123 * auVar3._0_4_;
      fVar240 = fVar123 * auVar3._4_4_;
      fVar241 = fVar123 * auVar3._8_4_;
      fVar242 = fVar123 * auVar3._12_4_;
      auVar211._0_4_ = auVar74._0_4_ * fVar218;
      auVar211._4_4_ = auVar74._4_4_ * fVar218;
      auVar211._8_4_ = auVar74._8_4_ * fVar218;
      auVar211._12_4_ = auVar74._12_4_ * fVar218;
      fVar218 = auVar75._0_4_;
      auVar179._0_4_ = fVar218 * auVar3._0_4_;
      auVar179._4_4_ = fVar218 * auVar3._4_4_;
      auVar179._8_4_ = fVar218 * auVar3._8_4_;
      auVar179._12_4_ = fVar218 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar211,auVar179);
      auVar75 = vrcp14ss_avx512f(auVar76,auVar201);
      auVar65 = vfnmadd213ss_avx512f(auVar65,auVar75,ZEXT416(0x40000000));
      fVar227 = auVar75._0_4_ * auVar65._0_4_;
      auVar65 = vdpps_avx(auVar73,auVar73,0x7f);
      fVar228 = auVar65._0_4_;
      auVar202._4_12_ = ZEXT812(0) << 0x20;
      auVar202._0_4_ = fVar228;
      auVar75 = vrsqrt14ss_avx512f(auVar76,auVar202);
      auVar74 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
      auVar71 = vmulss_avx512f(auVar65,ZEXT416(0xbf000000));
      fVar218 = auVar75._0_4_;
      fVar218 = auVar74._0_4_ + auVar71._0_4_ * fVar218 * fVar218 * fVar218;
      auVar75 = vdpps_avx(auVar73,auVar72,0x7f);
      fVar243 = fVar218 * auVar73._0_4_;
      fVar248 = fVar218 * auVar73._4_4_;
      fVar249 = fVar218 * auVar73._8_4_;
      fVar250 = fVar218 * auVar73._12_4_;
      auVar80._0_4_ = fVar228 * auVar72._0_4_;
      auVar80._4_4_ = fVar228 * auVar72._4_4_;
      auVar80._8_4_ = fVar228 * auVar72._8_4_;
      auVar80._12_4_ = fVar228 * auVar72._12_4_;
      fVar228 = auVar75._0_4_;
      auVar158._0_4_ = fVar228 * auVar73._0_4_;
      auVar158._4_4_ = fVar228 * auVar73._4_4_;
      auVar158._8_4_ = fVar228 * auVar73._8_4_;
      auVar158._12_4_ = fVar228 * auVar73._12_4_;
      auVar74 = vsubps_avx(auVar80,auVar158);
      auVar75 = vrcp14ss_avx512f(auVar76,auVar202);
      auVar65 = vfnmadd213ss_avx512f(auVar65,auVar75,ZEXT416(0x40000000));
      fVar228 = auVar65._0_4_ * auVar75._0_4_;
      auVar65 = vshufps_avx(auVar133,auVar133,0xff);
      auVar186._0_4_ = fVar229 * auVar65._0_4_;
      auVar186._4_4_ = fVar240 * auVar65._4_4_;
      auVar186._8_4_ = fVar241 * auVar65._8_4_;
      auVar186._12_4_ = fVar242 * auVar65._12_4_;
      local_520 = vsubps_avx(auVar133,auVar186);
      auVar75 = vshufps_avx(auVar68,auVar68,0xff);
      auVar88._0_4_ = auVar75._0_4_ * fVar229 + auVar65._0_4_ * fVar123 * fVar227 * auVar3._0_4_;
      auVar88._4_4_ = auVar75._4_4_ * fVar240 + auVar65._4_4_ * fVar123 * fVar227 * auVar3._4_4_;
      auVar88._8_4_ = auVar75._8_4_ * fVar241 + auVar65._8_4_ * fVar123 * fVar227 * auVar3._8_4_;
      auVar88._12_4_ = auVar75._12_4_ * fVar242 + auVar65._12_4_ * fVar123 * fVar227 * auVar3._12_4_
      ;
      auVar3 = vsubps_avx(auVar68,auVar88);
      local_530._0_4_ = auVar186._0_4_ + auVar133._0_4_;
      local_530._4_4_ = auVar186._4_4_ + auVar133._4_4_;
      fStack_528 = auVar186._8_4_ + auVar133._8_4_;
      fStack_524 = auVar186._12_4_ + auVar133._12_4_;
      auVar65 = vshufps_avx(auVar69,auVar69,0xff);
      auVar169._0_4_ = fVar243 * auVar65._0_4_;
      auVar169._4_4_ = fVar248 * auVar65._4_4_;
      auVar169._8_4_ = fVar249 * auVar65._8_4_;
      auVar169._12_4_ = fVar250 * auVar65._12_4_;
      local_540 = vsubps_avx512vl(auVar69,auVar169);
      auVar75 = vshufps_avx(auVar83,auVar83,0xff);
      auVar76._0_4_ = auVar75._0_4_ * fVar243 + auVar65._0_4_ * fVar218 * auVar74._0_4_ * fVar228;
      auVar76._4_4_ = auVar75._4_4_ * fVar248 + auVar65._4_4_ * fVar218 * auVar74._4_4_ * fVar228;
      auVar76._8_4_ = auVar75._8_4_ * fVar249 + auVar65._8_4_ * fVar218 * auVar74._8_4_ * fVar228;
      auVar76._12_4_ =
           auVar75._12_4_ * fVar250 + auVar65._12_4_ * fVar218 * auVar74._12_4_ * fVar228;
      auVar65 = vsubps_avx(auVar83,auVar76);
      local_550._0_4_ = auVar69._0_4_ + auVar169._0_4_;
      local_550._4_4_ = auVar69._4_4_ + auVar169._4_4_;
      fStack_548 = auVar69._8_4_ + auVar169._8_4_;
      fStack_544 = auVar69._12_4_ + auVar169._12_4_;
      auVar87._0_4_ = auVar3._0_4_ * 0.33333334;
      auVar87._4_4_ = auVar3._4_4_ * 0.33333334;
      auVar87._8_4_ = auVar3._8_4_ * 0.33333334;
      auVar87._12_4_ = auVar3._12_4_ * 0.33333334;
      local_560 = vaddps_avx512vl(local_520,auVar87);
      auVar81._0_4_ = auVar65._0_4_ * 0.33333334;
      auVar81._4_4_ = auVar65._4_4_ * 0.33333334;
      auVar81._8_4_ = auVar65._8_4_ * 0.33333334;
      auVar81._12_4_ = auVar65._12_4_ * 0.33333334;
      local_570 = vsubps_avx512vl(local_540,auVar81);
      auVar133._0_4_ = (fVar129 + auVar88._0_4_) * 0.33333334;
      auVar133._4_4_ = (fVar130 + auVar88._4_4_) * 0.33333334;
      auVar133._8_4_ = (fVar131 + auVar88._8_4_) * 0.33333334;
      auVar133._12_4_ = (fVar140 + auVar88._12_4_) * 0.33333334;
      _local_580 = vaddps_avx512vl(_local_530,auVar133);
      auVar66._0_4_ = (fVar149 + auVar76._0_4_) * 0.33333334;
      auVar66._4_4_ = (fVar155 + auVar76._4_4_) * 0.33333334;
      auVar66._8_4_ = (fVar156 + auVar76._8_4_) * 0.33333334;
      auVar66._12_4_ = (fVar157 + auVar76._12_4_) * 0.33333334;
      _local_590 = vsubps_avx512vl(_local_550,auVar66);
      local_4a0 = vsubps_avx(local_520,auVar4);
      uVar132 = local_4a0._0_4_;
      auVar77._4_4_ = uVar132;
      auVar77._0_4_ = uVar132;
      auVar77._8_4_ = uVar132;
      auVar77._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4a0,local_4a0,0x55);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      auVar75 = vshufps_avx(local_4a0,local_4a0,0xaa);
      fVar123 = pre->ray_space[k].vz.field_0.m128[0];
      fVar218 = pre->ray_space[k].vz.field_0.m128[1];
      fVar227 = pre->ray_space[k].vz.field_0.m128[2];
      fVar228 = pre->ray_space[k].vz.field_0.m128[3];
      auVar70._0_4_ = fVar123 * auVar75._0_4_;
      auVar70._4_4_ = fVar218 * auVar75._4_4_;
      auVar70._8_4_ = fVar227 * auVar75._8_4_;
      auVar70._12_4_ = fVar228 * auVar75._12_4_;
      auVar65 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar65);
      auVar73 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar77);
      local_4b0 = vsubps_avx512vl(local_560,auVar4);
      uVar132 = local_4b0._0_4_;
      auVar82._4_4_ = uVar132;
      auVar82._0_4_ = uVar132;
      auVar82._8_4_ = uVar132;
      auVar82._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4b0,local_4b0,0x55);
      auVar75 = vshufps_avx(local_4b0,local_4b0,0xaa);
      auVar78._0_4_ = fVar123 * auVar75._0_4_;
      auVar78._4_4_ = fVar218 * auVar75._4_4_;
      auVar78._8_4_ = fVar227 * auVar75._8_4_;
      auVar78._12_4_ = fVar228 * auVar75._12_4_;
      auVar65 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar65);
      auVar72 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar82);
      local_4c0 = vsubps_avx512vl(local_570,auVar4);
      uVar132 = local_4c0._0_4_;
      auVar170._4_4_ = uVar132;
      auVar170._0_4_ = uVar132;
      auVar170._8_4_ = uVar132;
      auVar170._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4c0,local_4c0,0x55);
      auVar75 = vshufps_avx(local_4c0,local_4c0,0xaa);
      auVar85._0_4_ = fVar123 * auVar75._0_4_;
      auVar85._4_4_ = fVar218 * auVar75._4_4_;
      auVar85._8_4_ = fVar227 * auVar75._8_4_;
      auVar85._12_4_ = fVar228 * auVar75._12_4_;
      auVar65 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar2,auVar65);
      auVar83 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar170);
      local_4d0 = vsubps_avx512vl(local_540,auVar4);
      uVar132 = local_4d0._0_4_;
      auVar187._4_4_ = uVar132;
      auVar187._0_4_ = uVar132;
      auVar187._8_4_ = uVar132;
      auVar187._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar75 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar171._0_4_ = fVar123 * auVar75._0_4_;
      auVar171._4_4_ = fVar218 * auVar75._4_4_;
      auVar171._8_4_ = fVar227 * auVar75._8_4_;
      auVar171._12_4_ = fVar228 * auVar75._12_4_;
      auVar65 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar2,auVar65);
      auVar71 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar187);
      local_4e0 = vsubps_avx(_local_530,auVar4);
      uVar132 = local_4e0._0_4_;
      auVar188._4_4_ = uVar132;
      auVar188._0_4_ = uVar132;
      auVar188._8_4_ = uVar132;
      auVar188._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar75 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar212._0_4_ = auVar75._0_4_ * fVar123;
      auVar212._4_4_ = auVar75._4_4_ * fVar218;
      auVar212._8_4_ = auVar75._8_4_ * fVar227;
      auVar212._12_4_ = auVar75._12_4_ * fVar228;
      auVar65 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar65);
      auVar133 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar188);
      local_4f0 = vsubps_avx512vl(_local_580,auVar4);
      uVar132 = local_4f0._0_4_;
      auVar189._4_4_ = uVar132;
      auVar189._0_4_ = uVar132;
      auVar189._8_4_ = uVar132;
      auVar189._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar75 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar219._0_4_ = auVar75._0_4_ * fVar123;
      auVar219._4_4_ = auVar75._4_4_ * fVar218;
      auVar219._8_4_ = auVar75._8_4_ * fVar227;
      auVar219._12_4_ = auVar75._12_4_ * fVar228;
      auVar65 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar65);
      auVar69 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar189);
      local_500 = vsubps_avx512vl(_local_590,auVar4);
      uVar132 = local_500._0_4_;
      auVar190._4_4_ = uVar132;
      auVar190._0_4_ = uVar132;
      auVar190._8_4_ = uVar132;
      auVar190._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_500,local_500,0x55);
      auVar75 = vshufps_avx(local_500,local_500,0xaa);
      auVar231._0_4_ = auVar75._0_4_ * fVar123;
      auVar231._4_4_ = auVar75._4_4_ * fVar218;
      auVar231._8_4_ = auVar75._8_4_ * fVar227;
      auVar231._12_4_ = auVar75._12_4_ * fVar228;
      auVar65 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar2,auVar65);
      auVar66 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar190);
      local_510 = vsubps_avx(_local_550,auVar4);
      uVar132 = local_510._0_4_;
      auVar68._4_4_ = uVar132;
      auVar68._0_4_ = uVar132;
      auVar68._8_4_ = uVar132;
      auVar68._12_4_ = uVar132;
      auVar65 = vshufps_avx(local_510,local_510,0x55);
      auVar75 = vshufps_avx(local_510,local_510,0xaa);
      auVar180._0_4_ = auVar75._0_4_ * fVar123;
      auVar180._4_4_ = auVar75._4_4_ * fVar218;
      auVar180._8_4_ = auVar75._8_4_ * fVar227;
      auVar180._12_4_ = auVar75._12_4_ * fVar228;
      auVar65 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar2,auVar65);
      auVar4 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar68);
      auVar3 = vmovlhps_avx(auVar73,auVar133);
      local_5f0 = vmovlhps_avx(auVar72,auVar69);
      local_600 = vmovlhps_avx512f(auVar83,auVar66);
      _local_480 = vmovlhps_avx512f(auVar71,auVar4);
      auVar75 = vminps_avx(auVar3,local_5f0);
      auVar65 = vmaxps_avx(auVar3,local_5f0);
      auVar74 = vminps_avx512vl(local_600,_local_480);
      auVar75 = vminps_avx(auVar75,auVar74);
      auVar74 = vmaxps_avx512vl(local_600,_local_480);
      auVar65 = vmaxps_avx(auVar65,auVar74);
      auVar74 = vshufpd_avx(auVar75,auVar75,3);
      auVar75 = vminps_avx(auVar75,auVar74);
      auVar74 = vshufpd_avx(auVar65,auVar65,3);
      auVar65 = vmaxps_avx(auVar65,auVar74);
      auVar75 = vandps_avx512vl(auVar75,auVar262._0_16_);
      auVar65 = vandps_avx512vl(auVar65,auVar262._0_16_);
      auVar65 = vmaxps_avx(auVar75,auVar65);
      auVar75 = vmovshdup_avx(auVar65);
      auVar65 = vmaxss_avx(auVar75,auVar65);
      local_610 = vmovddup_avx512vl(auVar73);
      auVar268 = ZEXT1664(local_610);
      local_620 = vmovddup_avx512vl(auVar72);
      auVar269 = ZEXT1664(local_620);
      auVar74 = vmovddup_avx512vl(auVar83);
      auVar73 = vmovddup_avx512vl(auVar71);
      local_470 = ZEXT416((uint)(auVar65._0_4_ * 9.536743e-07));
      local_440 = vbroadcastss_avx512vl(local_470);
      auVar65 = vxorps_avx512vl(local_440._0_16_,auVar263._0_16_);
      local_460 = vbroadcastss_avx512vl(auVar65);
      uVar53 = 0;
      auVar65 = vsubps_avx(local_5f0,auVar3);
      auVar72 = vsubps_avx512vl(local_600,local_5f0);
      local_490 = vsubps_avx512vl(_local_480,local_600);
      local_5a0 = vsubps_avx(_local_530,local_520);
      local_5b0 = vsubps_avx512vl(_local_580,local_560);
      local_5c0 = vsubps_avx512vl(_local_590,local_570);
      _local_5d0 = vsubps_avx512vl(_local_550,local_540);
      auVar128 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar128);
      auVar128 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar128);
      auVar75 = ZEXT816(0x3f80000000000000);
      auVar121._32_32_ = auVar128._32_32_;
      auVar67 = auVar75;
LAB_01cd0d71:
      auVar83 = vshufps_avx(auVar67,auVar67,0x50);
      auVar252._8_4_ = 0x3f800000;
      auVar252._0_8_ = 0x3f8000003f800000;
      auVar252._12_4_ = 0x3f800000;
      auVar255._16_4_ = 0x3f800000;
      auVar255._0_16_ = auVar252;
      auVar255._20_4_ = 0x3f800000;
      auVar255._24_4_ = 0x3f800000;
      auVar255._28_4_ = 0x3f800000;
      auVar71 = vsubps_avx(auVar252,auVar83);
      fVar123 = auVar83._0_4_;
      fVar129 = auVar133._0_4_;
      auVar150._0_4_ = fVar129 * fVar123;
      fVar218 = auVar83._4_4_;
      fVar130 = auVar133._4_4_;
      auVar150._4_4_ = fVar130 * fVar218;
      fVar227 = auVar83._8_4_;
      auVar150._8_4_ = fVar129 * fVar227;
      fVar228 = auVar83._12_4_;
      auVar150._12_4_ = fVar130 * fVar228;
      fVar131 = auVar69._0_4_;
      auVar159._0_4_ = fVar131 * fVar123;
      fVar140 = auVar69._4_4_;
      auVar159._4_4_ = fVar140 * fVar218;
      auVar159._8_4_ = fVar131 * fVar227;
      auVar159._12_4_ = fVar140 * fVar228;
      fVar149 = auVar66._0_4_;
      auVar172._0_4_ = fVar149 * fVar123;
      fVar155 = auVar66._4_4_;
      auVar172._4_4_ = fVar155 * fVar218;
      auVar172._8_4_ = fVar149 * fVar227;
      auVar172._12_4_ = fVar155 * fVar228;
      fVar156 = auVar4._0_4_;
      auVar135._0_4_ = fVar156 * fVar123;
      fVar157 = auVar4._4_4_;
      auVar135._4_4_ = fVar157 * fVar218;
      auVar135._8_4_ = fVar156 * fVar227;
      auVar135._12_4_ = fVar157 * fVar228;
      auVar68 = vfmadd231ps_avx512vl(auVar150,auVar71,auVar268._0_16_);
      auVar70 = vfmadd231ps_avx512vl(auVar159,auVar71,auVar269._0_16_);
      auVar76 = vfmadd231ps_avx512vl(auVar172,auVar71,auVar74);
      auVar71 = vfmadd231ps_avx512vl(auVar135,auVar73,auVar71);
      auVar83 = vmovshdup_avx(auVar75);
      fVar218 = auVar75._0_4_;
      fVar123 = (auVar83._0_4_ - fVar218) * 0.04761905;
      auVar198._4_4_ = fVar218;
      auVar198._0_4_ = fVar218;
      auVar198._8_4_ = fVar218;
      auVar198._12_4_ = fVar218;
      auVar198._16_4_ = fVar218;
      auVar198._20_4_ = fVar218;
      auVar198._24_4_ = fVar218;
      auVar198._28_4_ = fVar218;
      auVar147._0_8_ = auVar83._0_8_;
      auVar147._8_8_ = auVar147._0_8_;
      auVar147._16_8_ = auVar147._0_8_;
      auVar147._24_8_ = auVar147._0_8_;
      auVar94 = vsubps_avx(auVar147,auVar198);
      uVar132 = auVar68._0_4_;
      auVar148._4_4_ = uVar132;
      auVar148._0_4_ = uVar132;
      auVar148._8_4_ = uVar132;
      auVar148._12_4_ = uVar132;
      auVar148._16_4_ = uVar132;
      auVar148._20_4_ = uVar132;
      auVar148._24_4_ = uVar132;
      auVar148._28_4_ = uVar132;
      auVar215._8_4_ = 1;
      auVar215._0_8_ = 0x100000001;
      auVar215._12_4_ = 1;
      auVar215._16_4_ = 1;
      auVar215._20_4_ = 1;
      auVar215._24_4_ = 1;
      auVar215._28_4_ = 1;
      auVar105 = ZEXT1632(auVar68);
      auVar92 = vpermps_avx2(auVar215,auVar105);
      auVar95 = vbroadcastss_avx512vl(auVar70);
      auVar106 = ZEXT1632(auVar70);
      auVar93 = vpermps_avx512vl(auVar215,auVar106);
      auVar96 = vbroadcastss_avx512vl(auVar76);
      auVar103 = ZEXT1632(auVar76);
      auVar97 = vpermps_avx512vl(auVar215,auVar103);
      auVar98 = vbroadcastss_avx512vl(auVar71);
      auVar102 = ZEXT1632(auVar71);
      auVar99 = vpermps_avx512vl(auVar215,auVar102);
      auVar216._4_4_ = fVar123;
      auVar216._0_4_ = fVar123;
      auVar216._8_4_ = fVar123;
      auVar216._12_4_ = fVar123;
      auVar216._16_4_ = fVar123;
      auVar216._20_4_ = fVar123;
      auVar216._24_4_ = fVar123;
      auVar216._28_4_ = fVar123;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar100 = vpermps_avx512vl(auVar91,auVar105);
      auVar185._8_4_ = 3;
      auVar185._0_8_ = 0x300000003;
      auVar185._12_4_ = 3;
      auVar185._16_4_ = 3;
      auVar185._20_4_ = 3;
      auVar185._24_4_ = 3;
      auVar185._28_4_ = 3;
      auVar101 = vpermps_avx512vl(auVar185,auVar105);
      auVar89 = vpermps_avx512vl(auVar91,auVar106);
      auVar105 = vpermps_avx2(auVar185,auVar106);
      auVar90 = vpermps_avx512vl(auVar91,auVar103);
      auVar106 = vpermps_avx2(auVar185,auVar103);
      auVar91 = vpermps_avx512vl(auVar91,auVar102);
      auVar102 = vpermps_avx512vl(auVar185,auVar102);
      auVar83 = vfmadd132ps_fma(auVar94,auVar198,_DAT_01faff20);
      auVar94 = vsubps_avx(auVar255,ZEXT1632(auVar83));
      auVar103 = vmulps_avx512vl(auVar95,ZEXT1632(auVar83));
      auVar107 = ZEXT1632(auVar83);
      auVar104 = vmulps_avx512vl(auVar93,auVar107);
      auVar71 = vfmadd231ps_fma(auVar103,auVar94,auVar148);
      auVar68 = vfmadd231ps_fma(auVar104,auVar94,auVar92);
      auVar103 = vmulps_avx512vl(auVar96,auVar107);
      auVar104 = vmulps_avx512vl(auVar97,auVar107);
      auVar95 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar95);
      auVar93 = vfmadd231ps_avx512vl(auVar104,auVar94,auVar93);
      auVar103 = vmulps_avx512vl(auVar98,auVar107);
      auVar104 = ZEXT1632(auVar83);
      auVar99 = vmulps_avx512vl(auVar99,auVar104);
      auVar96 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar97);
      fVar227 = auVar83._0_4_;
      fVar228 = auVar83._4_4_;
      auVar29._4_4_ = fVar228 * auVar95._4_4_;
      auVar29._0_4_ = fVar227 * auVar95._0_4_;
      fVar229 = auVar83._8_4_;
      auVar29._8_4_ = fVar229 * auVar95._8_4_;
      fVar240 = auVar83._12_4_;
      auVar29._12_4_ = fVar240 * auVar95._12_4_;
      auVar29._16_4_ = auVar95._16_4_ * 0.0;
      auVar29._20_4_ = auVar95._20_4_ * 0.0;
      auVar29._24_4_ = auVar95._24_4_ * 0.0;
      auVar29._28_4_ = fVar218;
      auVar30._4_4_ = fVar228 * auVar93._4_4_;
      auVar30._0_4_ = fVar227 * auVar93._0_4_;
      auVar30._8_4_ = fVar229 * auVar93._8_4_;
      auVar30._12_4_ = fVar240 * auVar93._12_4_;
      auVar30._16_4_ = auVar93._16_4_ * 0.0;
      auVar30._20_4_ = auVar93._20_4_ * 0.0;
      auVar30._24_4_ = auVar93._24_4_ * 0.0;
      auVar30._28_4_ = auVar92._28_4_;
      auVar71 = vfmadd231ps_fma(auVar29,auVar94,ZEXT1632(auVar71));
      auVar68 = vfmadd231ps_fma(auVar30,auVar94,ZEXT1632(auVar68));
      auVar138._0_4_ = fVar227 * auVar96._0_4_;
      auVar138._4_4_ = fVar228 * auVar96._4_4_;
      auVar138._8_4_ = fVar229 * auVar96._8_4_;
      auVar138._12_4_ = fVar240 * auVar96._12_4_;
      auVar138._16_4_ = auVar96._16_4_ * 0.0;
      auVar138._20_4_ = auVar96._20_4_ * 0.0;
      auVar138._24_4_ = auVar96._24_4_ * 0.0;
      auVar138._28_4_ = 0;
      auVar31._4_4_ = fVar228 * auVar97._4_4_;
      auVar31._0_4_ = fVar227 * auVar97._0_4_;
      auVar31._8_4_ = fVar229 * auVar97._8_4_;
      auVar31._12_4_ = fVar240 * auVar97._12_4_;
      auVar31._16_4_ = auVar97._16_4_ * 0.0;
      auVar31._20_4_ = auVar97._20_4_ * 0.0;
      auVar31._24_4_ = auVar97._24_4_ * 0.0;
      auVar31._28_4_ = auVar96._28_4_;
      auVar70 = vfmadd231ps_fma(auVar138,auVar94,auVar95);
      auVar76 = vfmadd231ps_fma(auVar31,auVar94,auVar93);
      auVar32._28_4_ = auVar93._28_4_;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar240 * auVar76._12_4_,
                              CONCAT48(fVar229 * auVar76._8_4_,
                                       CONCAT44(fVar228 * auVar76._4_4_,fVar227 * auVar76._0_4_))));
      auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar240 * auVar70._12_4_,
                                                   CONCAT48(fVar229 * auVar70._8_4_,
                                                            CONCAT44(fVar228 * auVar70._4_4_,
                                                                     fVar227 * auVar70._0_4_)))),
                                auVar94,ZEXT1632(auVar71));
      auVar78 = vfmadd231ps_fma(auVar32,auVar94,ZEXT1632(auVar68));
      auVar92 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar71));
      auVar95 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar68));
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar92 = vmulps_avx512vl(auVar92,auVar93);
      auVar95 = vmulps_avx512vl(auVar95,auVar93);
      auVar210._0_4_ = fVar123 * auVar92._0_4_;
      auVar210._4_4_ = fVar123 * auVar92._4_4_;
      auVar210._8_4_ = fVar123 * auVar92._8_4_;
      auVar210._12_4_ = fVar123 * auVar92._12_4_;
      auVar210._16_4_ = fVar123 * auVar92._16_4_;
      auVar210._20_4_ = fVar123 * auVar92._20_4_;
      auVar210._24_4_ = fVar123 * auVar92._24_4_;
      auVar210._28_4_ = 0;
      auVar92 = vmulps_avx512vl(auVar216,auVar95);
      auVar68 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
      auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar77),_DAT_01feed00,ZEXT1632(auVar68));
      auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01feed00,ZEXT1632(auVar68));
      auVar139._0_4_ = auVar210._0_4_ + auVar77._0_4_;
      auVar139._4_4_ = auVar210._4_4_ + auVar77._4_4_;
      auVar139._8_4_ = auVar210._8_4_ + auVar77._8_4_;
      auVar139._12_4_ = auVar210._12_4_ + auVar77._12_4_;
      auVar139._16_4_ = auVar210._16_4_ + 0.0;
      auVar139._20_4_ = auVar210._20_4_ + 0.0;
      auVar139._24_4_ = auVar210._24_4_ + 0.0;
      auVar139._28_4_ = 0;
      auVar107 = ZEXT1632(auVar68);
      auVar97 = vpermt2ps_avx512vl(auVar210,_DAT_01feed00,auVar107);
      auVar98 = vaddps_avx512vl(ZEXT1632(auVar78),auVar92);
      auVar99 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar107);
      auVar92 = vsubps_avx(auVar95,auVar97);
      auVar97 = vsubps_avx512vl(auVar96,auVar99);
      auVar99 = vmulps_avx512vl(auVar89,auVar104);
      auVar103 = vmulps_avx512vl(auVar105,auVar104);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar100);
      auVar100 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar101);
      auVar101 = vmulps_avx512vl(auVar90,auVar104);
      auVar103 = vmulps_avx512vl(auVar106,auVar104);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar89);
      auVar105 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar105);
      auVar91 = vmulps_avx512vl(auVar91,auVar104);
      auVar89 = vmulps_avx512vl(auVar102,auVar104);
      auVar71 = vfmadd231ps_fma(auVar91,auVar94,auVar90);
      auVar91 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar106);
      auVar89 = vmulps_avx512vl(auVar104,auVar101);
      auVar102 = ZEXT1632(auVar83);
      auVar90 = vmulps_avx512vl(auVar102,auVar105);
      auVar99 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar100);
      auVar91 = vmulps_avx512vl(auVar102,auVar91);
      auVar101 = vfmadd231ps_avx512vl
                           (ZEXT1632(CONCAT412(fVar240 * auVar71._12_4_,
                                               CONCAT48(fVar229 * auVar71._8_4_,
                                                        CONCAT44(fVar228 * auVar71._4_4_,
                                                                 fVar227 * auVar71._0_4_)))),auVar94
                            ,auVar101);
      auVar105 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar105);
      auVar33._4_4_ = fVar228 * auVar101._4_4_;
      auVar33._0_4_ = fVar227 * auVar101._0_4_;
      auVar33._8_4_ = fVar229 * auVar101._8_4_;
      auVar33._12_4_ = fVar240 * auVar101._12_4_;
      auVar33._16_4_ = auVar101._16_4_ * 0.0;
      auVar33._20_4_ = auVar101._20_4_ * 0.0;
      auVar33._24_4_ = auVar101._24_4_ * 0.0;
      auVar33._28_4_ = auVar106._28_4_;
      auVar106 = vmulps_avx512vl(auVar102,auVar105);
      auVar91 = vfmadd231ps_avx512vl(auVar33,auVar94,auVar99);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar94);
      auVar94 = vsubps_avx512vl(auVar101,auVar99);
      auVar105 = vsubps_avx512vl(auVar105,auVar100);
      auVar94 = vmulps_avx512vl(auVar94,auVar93);
      auVar105 = vmulps_avx512vl(auVar105,auVar93);
      fVar218 = fVar123 * auVar94._0_4_;
      fVar227 = fVar123 * auVar94._4_4_;
      auVar34._4_4_ = fVar227;
      auVar34._0_4_ = fVar218;
      fVar228 = fVar123 * auVar94._8_4_;
      auVar34._8_4_ = fVar228;
      fVar229 = fVar123 * auVar94._12_4_;
      auVar34._12_4_ = fVar229;
      fVar240 = fVar123 * auVar94._16_4_;
      auVar34._16_4_ = fVar240;
      fVar241 = fVar123 * auVar94._20_4_;
      auVar34._20_4_ = fVar241;
      fVar123 = fVar123 * auVar94._24_4_;
      auVar34._24_4_ = fVar123;
      auVar34._28_4_ = auVar94._28_4_;
      auVar105 = vmulps_avx512vl(auVar216,auVar105);
      auVar93 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,auVar107);
      auVar99 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar107);
      auVar217._0_4_ = auVar91._0_4_ + fVar218;
      auVar217._4_4_ = auVar91._4_4_ + fVar227;
      auVar217._8_4_ = auVar91._8_4_ + fVar228;
      auVar217._12_4_ = auVar91._12_4_ + fVar229;
      auVar217._16_4_ = auVar91._16_4_ + fVar240;
      auVar217._20_4_ = auVar91._20_4_ + fVar241;
      auVar217._24_4_ = auVar91._24_4_ + fVar123;
      auVar217._28_4_ = auVar91._28_4_ + auVar94._28_4_;
      auVar94 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,ZEXT1632(auVar68));
      auVar100 = vaddps_avx512vl(auVar106,auVar105);
      auVar105 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar68));
      auVar94 = vsubps_avx(auVar93,auVar94);
      auVar105 = vsubps_avx512vl(auVar99,auVar105);
      auVar153 = ZEXT1632(auVar77);
      auVar101 = vsubps_avx512vl(auVar91,auVar153);
      auVar165 = ZEXT1632(auVar78);
      auVar89 = vsubps_avx512vl(auVar106,auVar165);
      auVar90 = vsubps_avx512vl(auVar93,auVar95);
      auVar101 = vaddps_avx512vl(auVar101,auVar90);
      auVar90 = vsubps_avx512vl(auVar99,auVar96);
      auVar89 = vaddps_avx512vl(auVar89,auVar90);
      auVar90 = vmulps_avx512vl(auVar165,auVar101);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar153,auVar89);
      auVar102 = vmulps_avx512vl(auVar98,auVar101);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar139,auVar89);
      auVar103 = vmulps_avx512vl(auVar97,auVar101);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar92,auVar89);
      auVar104 = vmulps_avx512vl(auVar96,auVar101);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar95,auVar89);
      auVar107 = vmulps_avx512vl(auVar106,auVar101);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar91,auVar89);
      auVar108 = vmulps_avx512vl(auVar100,auVar101);
      auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar217,auVar89);
      auVar109 = vmulps_avx512vl(auVar105,auVar101);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar94,auVar89);
      auVar101 = vmulps_avx512vl(auVar99,auVar101);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar93,auVar89);
      auVar89 = vminps_avx512vl(auVar90,auVar102);
      auVar90 = vmaxps_avx512vl(auVar90,auVar102);
      auVar102 = vminps_avx512vl(auVar103,auVar104);
      auVar89 = vminps_avx512vl(auVar89,auVar102);
      auVar102 = vmaxps_avx512vl(auVar103,auVar104);
      auVar90 = vmaxps_avx512vl(auVar90,auVar102);
      auVar102 = vminps_avx512vl(auVar107,auVar108);
      auVar103 = vmaxps_avx512vl(auVar107,auVar108);
      auVar104 = vminps_avx512vl(auVar109,auVar101);
      auVar102 = vminps_avx512vl(auVar102,auVar104);
      auVar89 = vminps_avx512vl(auVar89,auVar102);
      auVar101 = vmaxps_avx512vl(auVar109,auVar101);
      auVar101 = vmaxps_avx512vl(auVar103,auVar101);
      auVar101 = vmaxps_avx512vl(auVar90,auVar101);
      uVar23 = vcmpps_avx512vl(auVar89,local_440,2);
      uVar24 = vcmpps_avx512vl(auVar101,local_460,5);
      bVar51 = (byte)uVar23 & (byte)uVar24 & 0x7f;
      if (bVar51 != 0) {
        auVar101 = vsubps_avx512vl(auVar95,auVar153);
        auVar89 = vsubps_avx512vl(auVar96,auVar165);
        auVar90 = vsubps_avx512vl(auVar93,auVar91);
        auVar101 = vaddps_avx512vl(auVar101,auVar90);
        auVar90 = vsubps_avx512vl(auVar99,auVar106);
        auVar89 = vaddps_avx512vl(auVar89,auVar90);
        auVar90 = vmulps_avx512vl(auVar165,auVar101);
        auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar89,auVar153);
        auVar98 = vmulps_avx512vl(auVar98,auVar101);
        auVar98 = vfnmadd213ps_avx512vl(auVar139,auVar89,auVar98);
        auVar97 = vmulps_avx512vl(auVar97,auVar101);
        auVar97 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar97);
        auVar92 = vmulps_avx512vl(auVar96,auVar101);
        auVar96 = vfnmadd231ps_avx512vl(auVar92,auVar89,auVar95);
        auVar92 = vmulps_avx512vl(auVar106,auVar101);
        auVar106 = vfnmadd231ps_avx512vl(auVar92,auVar89,auVar91);
        auVar92 = vmulps_avx512vl(auVar100,auVar101);
        auVar91 = vfnmadd213ps_avx512vl(auVar217,auVar89,auVar92);
        auVar92 = vmulps_avx512vl(auVar105,auVar101);
        auVar100 = vfnmadd213ps_avx512vl(auVar94,auVar89,auVar92);
        auVar94 = vmulps_avx512vl(auVar99,auVar101);
        auVar93 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar89);
        auVar92 = vminps_avx(auVar90,auVar98);
        auVar94 = vmaxps_avx(auVar90,auVar98);
        auVar95 = vminps_avx(auVar97,auVar96);
        auVar95 = vminps_avx(auVar92,auVar95);
        auVar92 = vmaxps_avx(auVar97,auVar96);
        auVar94 = vmaxps_avx(auVar94,auVar92);
        auVar105 = vminps_avx(auVar106,auVar91);
        auVar92 = vmaxps_avx(auVar106,auVar91);
        auVar106 = vminps_avx(auVar100,auVar93);
        auVar105 = vminps_avx(auVar105,auVar106);
        auVar105 = vminps_avx(auVar95,auVar105);
        auVar95 = vmaxps_avx(auVar100,auVar93);
        auVar92 = vmaxps_avx(auVar92,auVar95);
        auVar94 = vmaxps_avx(auVar94,auVar92);
        uVar23 = vcmpps_avx512vl(auVar94,local_460,5);
        uVar24 = vcmpps_avx512vl(auVar105,local_440,2);
        bVar51 = bVar51 & (byte)uVar23 & (byte)uVar24;
        if (bVar51 != 0) {
          auStack_5e0[uVar53] = (uint)bVar51;
          uVar23 = vmovlps_avx(auVar75);
          (&uStack_420)[uVar53] = uVar23;
          uVar59 = vmovlps_avx(auVar67);
          auStack_3a0[uVar53] = uVar59;
          uVar53 = (ulong)((int)uVar53 + 1);
        }
      }
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar128 = ZEXT1664(auVar75);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar262 = ZEXT1664(auVar75);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar263 = ZEXT1664(auVar75);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar264 = ZEXT3264(auVar94);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar265 = ZEXT1664(auVar75);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar266 = ZEXT1664(auVar75);
      auVar110._32_32_ = auVar121._32_32_;
      auVar110._0_32_ = _DAT_01feed20;
      auVar267 = ZEXT3264(_DAT_01feed20);
      auVar111._16_48_ = auVar110._16_48_;
      if ((int)uVar53 != 0) {
        do {
          auVar121._32_32_ = auVar111._32_32_;
          auVar71 = auVar269._0_16_;
          auVar83 = auVar268._0_16_;
          uVar52 = (int)uVar53 - 1;
          uVar54 = (ulong)uVar52;
          uVar7 = auStack_5e0[uVar54];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = auStack_3a0[uVar54];
          uVar59 = 0;
          for (uVar57 = (ulong)uVar7; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000)
          {
            uVar59 = uVar59 + 1;
          }
          uVar56 = uVar7 - 1 & uVar7;
          bVar63 = uVar56 == 0;
          auStack_5e0[uVar54] = uVar56;
          if (bVar63) {
            uVar53 = (ulong)uVar52;
          }
          auVar124._8_8_ = 0;
          auVar124._0_8_ = uVar59;
          auVar75 = vpunpcklqdq_avx(auVar124,ZEXT416((int)uVar59 + 1));
          auVar75 = vcvtqq2ps_avx512vl(auVar75);
          auVar75 = vmulps_avx512vl(auVar75,auVar265._0_16_);
          uVar132 = *(undefined4 *)((long)&uStack_420 + uVar54 * 8 + 4);
          auVar25._4_4_ = uVar132;
          auVar25._0_4_ = uVar132;
          auVar25._8_4_ = uVar132;
          auVar25._12_4_ = uVar132;
          auVar68 = vmulps_avx512vl(auVar75,auVar25);
          auVar70 = auVar266._0_16_;
          auVar75 = vsubps_avx512vl(auVar70,auVar75);
          uVar132 = *(undefined4 *)(&uStack_420 + uVar54);
          auVar26._4_4_ = uVar132;
          auVar26._0_4_ = uVar132;
          auVar26._8_4_ = uVar132;
          auVar26._12_4_ = uVar132;
          auVar75 = vfmadd231ps_avx512vl(auVar68,auVar75,auVar26);
          auVar68 = vmovshdup_avx(auVar75);
          fVar123 = auVar68._0_4_ - auVar75._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar123));
          if (uVar7 == 0 || bVar63) goto LAB_01cd0d71;
          auVar68 = vshufps_avx(auVar67,auVar67,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar123));
          auVar76 = vsubps_avx512vl(auVar70,auVar68);
          fVar218 = auVar68._0_4_;
          auVar160._0_4_ = fVar218 * fVar129;
          fVar227 = auVar68._4_4_;
          auVar160._4_4_ = fVar227 * fVar130;
          fVar228 = auVar68._8_4_;
          auVar160._8_4_ = fVar228 * fVar129;
          fVar229 = auVar68._12_4_;
          auVar160._12_4_ = fVar229 * fVar130;
          auVar173._0_4_ = fVar218 * fVar131;
          auVar173._4_4_ = fVar227 * fVar140;
          auVar173._8_4_ = fVar228 * fVar131;
          auVar173._12_4_ = fVar229 * fVar140;
          auVar181._0_4_ = fVar218 * fVar149;
          auVar181._4_4_ = fVar227 * fVar155;
          auVar181._8_4_ = fVar228 * fVar149;
          auVar181._12_4_ = fVar229 * fVar155;
          auVar142._0_4_ = fVar218 * fVar156;
          auVar142._4_4_ = fVar227 * fVar157;
          auVar142._8_4_ = fVar228 * fVar156;
          auVar142._12_4_ = fVar229 * fVar157;
          auVar77 = vfmadd231ps_avx512vl(auVar160,auVar76,auVar83);
          auVar78 = vfmadd231ps_avx512vl(auVar173,auVar76,auVar71);
          auVar68 = vfmadd231ps_fma(auVar181,auVar76,auVar74);
          auVar76 = vfmadd231ps_fma(auVar142,auVar76,auVar73);
          auVar154._16_16_ = auVar77;
          auVar154._0_16_ = auVar77;
          auVar166._16_16_ = auVar78;
          auVar166._0_16_ = auVar78;
          auVar178._16_16_ = auVar68;
          auVar178._0_16_ = auVar68;
          auVar92 = vpermps_avx512vl(auVar267._0_32_,ZEXT1632(auVar75));
          auVar94 = vsubps_avx(auVar166,auVar154);
          auVar77 = vfmadd213ps_fma(auVar94,auVar92,auVar154);
          auVar94 = vsubps_avx(auVar178,auVar166);
          auVar78 = vfmadd213ps_fma(auVar94,auVar92,auVar166);
          auVar68 = vsubps_avx(auVar76,auVar68);
          auVar167._16_16_ = auVar68;
          auVar167._0_16_ = auVar68;
          auVar68 = vfmadd213ps_fma(auVar167,auVar92,auVar178);
          auVar94 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar77));
          auVar76 = vfmadd213ps_fma(auVar94,auVar92,ZEXT1632(auVar77));
          auVar94 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar78));
          auVar68 = vfmadd213ps_fma(auVar94,auVar92,ZEXT1632(auVar78));
          auVar94 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar76));
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar94,auVar92);
          auVar121._0_32_ = vmulps_avx512vl(auVar94,auVar264._0_32_);
          fVar218 = fVar123 * 0.33333334;
          auVar182._0_8_ =
               CONCAT44(auVar168._4_4_ + fVar218 * auVar121._4_4_,
                        auVar168._0_4_ + fVar218 * auVar121._0_4_);
          auVar182._8_4_ = auVar168._8_4_ + fVar218 * auVar121._8_4_;
          auVar182._12_4_ = auVar168._12_4_ + fVar218 * auVar121._12_4_;
          auVar161._0_4_ = fVar218 * auVar121._16_4_;
          auVar161._4_4_ = fVar218 * auVar121._20_4_;
          auVar161._8_4_ = fVar218 * auVar121._24_4_;
          auVar161._12_4_ = fVar218 * auVar121._28_4_;
          auVar85 = vsubps_avx((undefined1  [16])0x0,auVar161);
          auVar86 = vshufpd_avx(auVar168,auVar168,3);
          auVar87 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar68 = vsubps_avx(auVar86,auVar168);
          auVar76 = vsubps_avx(auVar87,(undefined1  [16])0x0);
          auVar203._0_4_ = auVar68._0_4_ + auVar76._0_4_;
          auVar203._4_4_ = auVar68._4_4_ + auVar76._4_4_;
          auVar203._8_4_ = auVar68._8_4_ + auVar76._8_4_;
          auVar203._12_4_ = auVar68._12_4_ + auVar76._12_4_;
          auVar68 = vshufps_avx(auVar168,auVar168,0xb1);
          auVar76 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar77 = vshufps_avx(auVar85,auVar85,0xb1);
          auVar78 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar253._4_4_ = auVar203._0_4_;
          auVar253._0_4_ = auVar203._0_4_;
          auVar253._8_4_ = auVar203._0_4_;
          auVar253._12_4_ = auVar203._0_4_;
          auVar81 = vshufps_avx(auVar203,auVar203,0x55);
          fVar218 = auVar81._0_4_;
          auVar213._0_4_ = auVar68._0_4_ * fVar218;
          fVar227 = auVar81._4_4_;
          auVar213._4_4_ = auVar68._4_4_ * fVar227;
          fVar228 = auVar81._8_4_;
          auVar213._8_4_ = auVar68._8_4_ * fVar228;
          fVar229 = auVar81._12_4_;
          auVar213._12_4_ = auVar68._12_4_ * fVar229;
          auVar220._0_4_ = auVar76._0_4_ * fVar218;
          auVar220._4_4_ = auVar76._4_4_ * fVar227;
          auVar220._8_4_ = auVar76._8_4_ * fVar228;
          auVar220._12_4_ = auVar76._12_4_ * fVar229;
          auVar232._0_4_ = auVar77._0_4_ * fVar218;
          auVar232._4_4_ = auVar77._4_4_ * fVar227;
          auVar232._8_4_ = auVar77._8_4_ * fVar228;
          auVar232._12_4_ = auVar77._12_4_ * fVar229;
          auVar204._0_4_ = auVar78._0_4_ * fVar218;
          auVar204._4_4_ = auVar78._4_4_ * fVar227;
          auVar204._8_4_ = auVar78._8_4_ * fVar228;
          auVar204._12_4_ = auVar78._12_4_ * fVar229;
          auVar68 = vfmadd231ps_fma(auVar213,auVar253,auVar168);
          auVar76 = vfmadd231ps_fma(auVar220,auVar253,auVar182);
          auVar84 = vfmadd231ps_fma(auVar232,auVar253,auVar85);
          auVar158 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar253);
          auVar81 = vshufpd_avx(auVar68,auVar68,1);
          auVar82 = vshufpd_avx(auVar76,auVar76,1);
          auVar111._16_48_ = auVar121._16_48_;
          auVar79 = vshufpd_avx512vl(auVar84,auVar84,1);
          auVar80 = vshufpd_avx512vl(auVar158,auVar158,1);
          auVar77 = vminss_avx(auVar68,auVar76);
          auVar68 = vmaxss_avx(auVar76,auVar68);
          auVar78 = vminss_avx(auVar84,auVar158);
          auVar76 = vmaxss_avx(auVar158,auVar84);
          auVar77 = vminss_avx(auVar77,auVar78);
          auVar68 = vmaxss_avx(auVar76,auVar68);
          auVar78 = vminss_avx(auVar81,auVar82);
          auVar76 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vminss_avx512f(auVar79,auVar80);
          auVar82 = vmaxss_avx512f(auVar80,auVar79);
          auVar76 = vmaxss_avx(auVar82,auVar76);
          auVar78 = vminss_avx512f(auVar78,auVar81);
          fVar227 = auVar76._0_4_;
          fVar218 = auVar68._0_4_;
          if (0.0001 <= auVar77._0_4_) {
LAB_01cd14ac:
            vucomiss_avx512f(auVar78);
            bVar64 = fVar227 <= -0.0001;
            bVar62 = -0.0001 < fVar218;
            bVar61 = bVar64;
            if (!bVar64) goto LAB_01cd1502;
            uVar23 = vcmpps_avx512vl(auVar77,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar24 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
            bVar51 = (byte)uVar23 & (byte)uVar24 & 1;
            bVar64 = bVar62 && bVar51 == 0;
            bVar61 = bVar62 && bVar51 == 0;
            if (bVar62 && bVar51 == 0) goto LAB_01cd1502;
          }
          else {
            bVar64 = fVar227 == -0.0001;
            bVar61 = NAN(fVar227);
            if (fVar227 <= -0.0001) goto LAB_01cd14ac;
LAB_01cd1502:
            auVar82 = vxorps_avx512vl(auVar71,auVar71);
            vcmpss_avx512f(auVar77,auVar82,1);
            uVar23 = vcmpss_avx512f(auVar68,auVar82,1);
            bVar62 = (bool)((byte)uVar23 & 1);
            auVar111._0_16_ = auVar270._0_16_;
            auVar268._4_60_ = auVar111._4_60_;
            auVar268._0_4_ = (float)((uint)bVar62 * -0x40800000 + (uint)!bVar62 * auVar270._0_4_);
            vucomiss_avx512f(auVar268._0_16_);
            bVar61 = (bool)(!bVar64 | bVar61);
            bVar62 = bVar61 == false;
            auVar112._16_48_ = auVar111._16_48_;
            auVar112._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar269._4_60_ = auVar112._4_60_;
            auVar269._0_4_ = (uint)bVar61 * auVar82._0_4_ + (uint)!bVar61 * 0x7f800000;
            auVar81 = auVar269._0_16_;
            auVar114._16_48_ = auVar111._16_48_;
            auVar114._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar113._4_60_ = auVar114._4_60_;
            auVar113._0_4_ = (uint)bVar61 * auVar82._0_4_ + (uint)!bVar61 * -0x800000;
            auVar71 = auVar113._0_16_;
            auVar83 = vxorps_avx512vl(auVar83,auVar83);
            uVar23 = vcmpss_avx512f(auVar78,auVar82,1);
            bVar64 = (bool)((byte)uVar23 & 1);
            auVar116._16_48_ = auVar111._16_48_;
            auVar116._0_16_ = auVar270._0_16_;
            auVar115._4_60_ = auVar116._4_60_;
            auVar115._0_4_ = (float)((uint)bVar64 * -0x40800000 + (uint)!bVar64 * auVar270._0_4_);
            vucomiss_avx512f(auVar115._0_16_);
            if ((bVar61) || (bVar62)) {
              auVar78 = vucomiss_avx512f(auVar77);
              if ((bVar61) || (bVar62)) {
                auVar82 = vxorps_avx512vl(auVar77,auVar263._0_16_);
                auVar77 = vsubss_avx512f(auVar78,auVar77);
                auVar77 = vdivss_avx512f(auVar82,auVar77);
                auVar78 = vsubss_avx512f(ZEXT416(0x3f800000),auVar77);
                auVar78 = vfmadd213ss_avx512f(auVar78,auVar83,auVar77);
                auVar77 = auVar78;
              }
              else {
                auVar77 = vxorps_avx512vl(auVar78,auVar78);
                vucomiss_avx512f(auVar77);
                auVar78 = ZEXT416(0x3f800000);
                if ((bVar61) || (bVar62)) {
                  auVar78 = SUB6416(ZEXT464(0xff800000),0);
                  auVar77 = ZEXT416(0x7f800000);
                }
              }
              auVar81 = vminss_avx512f(auVar81,auVar77);
              auVar71 = vmaxss_avx(auVar78,auVar71);
            }
            auVar270 = ZEXT464(0x3f800000);
            uVar23 = vcmpss_avx512f(auVar76,auVar83,1);
            bVar64 = (bool)((byte)uVar23 & 1);
            auVar76 = auVar270._0_16_;
            fVar228 = (float)((uint)bVar64 * -0x40800000 + (uint)!bVar64 * 0x3f800000);
            if ((auVar268._0_4_ != fVar228) || (NAN(auVar268._0_4_) || NAN(fVar228))) {
              if ((fVar227 != fVar218) || (NAN(fVar227) || NAN(fVar218))) {
                auVar68 = vxorps_avx512vl(auVar68,auVar263._0_16_);
                auVar205._0_4_ = auVar68._0_4_ / (fVar227 - fVar218);
                auVar205._4_12_ = auVar68._4_12_;
                auVar68 = vsubss_avx512f(auVar76,auVar205);
                auVar68 = vfmadd213ss_avx512f(auVar68,auVar83,auVar205);
                auVar77 = auVar68;
              }
              else if ((fVar218 != 0.0) ||
                      (auVar68 = auVar76, auVar77 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar218))) {
                auVar68 = SUB6416(ZEXT464(0xff800000),0);
                auVar77 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar81 = vminss_avx(auVar81,auVar77);
              auVar71 = vmaxss_avx(auVar68,auVar71);
            }
            bVar64 = auVar115._0_4_ != fVar228;
            auVar68 = vminss_avx512f(auVar81,auVar76);
            auVar118._16_48_ = auVar111._16_48_;
            auVar118._0_16_ = auVar81;
            auVar117._4_60_ = auVar118._4_60_;
            auVar117._0_4_ = (uint)bVar64 * auVar68._0_4_ + (uint)!bVar64 * auVar81._0_4_;
            auVar68 = vmaxss_avx512f(auVar76,auVar71);
            auVar120._16_48_ = auVar111._16_48_;
            auVar120._0_16_ = auVar71;
            auVar119._4_60_ = auVar120._4_60_;
            auVar119._0_4_ = (uint)bVar64 * auVar68._0_4_ + (uint)!bVar64 * auVar71._0_4_;
            auVar71 = vmaxss_avx512f(auVar83,auVar117._0_16_);
            auVar68 = vminss_avx512f(auVar119._0_16_,auVar76);
            if (auVar71._0_4_ <= auVar68._0_4_) {
              auVar82 = vmaxss_avx512f(auVar83,ZEXT416((uint)(auVar71._0_4_ + -0.1)));
              auVar84 = vminss_avx512f(ZEXT416((uint)(auVar68._0_4_ + 0.1)),auVar76);
              auVar143._0_8_ = auVar168._0_8_;
              auVar143._8_8_ = auVar143._0_8_;
              auVar221._8_8_ = auVar182._0_8_;
              auVar221._0_8_ = auVar182._0_8_;
              auVar233._8_8_ = auVar85._0_8_;
              auVar233._0_8_ = auVar85._0_8_;
              auVar71 = vshufpd_avx(auVar182,auVar182,3);
              auVar68 = vshufpd_avx(auVar85,auVar85,3);
              auVar77 = vshufps_avx(auVar82,auVar84,0);
              auVar81 = vsubps_avx512vl(auVar70,auVar77);
              fVar218 = auVar77._0_4_;
              auVar174._0_4_ = fVar218 * auVar86._0_4_;
              fVar227 = auVar77._4_4_;
              auVar174._4_4_ = fVar227 * auVar86._4_4_;
              fVar228 = auVar77._8_4_;
              auVar174._8_4_ = fVar228 * auVar86._8_4_;
              fVar229 = auVar77._12_4_;
              auVar174._12_4_ = fVar229 * auVar86._12_4_;
              auVar183._0_4_ = fVar218 * auVar71._0_4_;
              auVar183._4_4_ = fVar227 * auVar71._4_4_;
              auVar183._8_4_ = fVar228 * auVar71._8_4_;
              auVar183._12_4_ = fVar229 * auVar71._12_4_;
              auVar256._0_4_ = auVar68._0_4_ * fVar218;
              auVar256._4_4_ = auVar68._4_4_ * fVar227;
              auVar256._8_4_ = auVar68._8_4_ * fVar228;
              auVar256._12_4_ = auVar68._12_4_ * fVar229;
              auVar162._0_4_ = fVar218 * auVar87._0_4_;
              auVar162._4_4_ = fVar227 * auVar87._4_4_;
              auVar162._8_4_ = fVar228 * auVar87._8_4_;
              auVar162._12_4_ = fVar229 * auVar87._12_4_;
              auVar78 = vfmadd231ps_fma(auVar174,auVar81,auVar143);
              auVar86 = vfmadd231ps_fma(auVar183,auVar81,auVar221);
              auVar87 = vfmadd231ps_fma(auVar256,auVar81,auVar233);
              auVar81 = vfmadd231ps_fma(auVar162,auVar81,ZEXT816(0));
              auVar68 = vsubss_avx512f(auVar76,auVar82);
              auVar71 = vmovshdup_avx(auVar67);
              auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar82._0_4_)),auVar67,
                                         auVar68);
              auVar68 = vsubss_avx512f(auVar76,auVar84);
              auVar168 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar84._0_4_)),auVar67,
                                         auVar68);
              auVar82 = vdivss_avx512f(auVar76,ZEXT416((uint)fVar123));
              auVar71 = vsubps_avx(auVar86,auVar78);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar68 = vmulps_avx512vl(auVar71,auVar85);
              auVar71 = vsubps_avx(auVar87,auVar86);
              auVar77 = vmulps_avx512vl(auVar71,auVar85);
              auVar71 = vsubps_avx(auVar81,auVar87);
              auVar71 = vmulps_avx512vl(auVar71,auVar85);
              auVar67 = vminps_avx(auVar77,auVar71);
              auVar71 = vmaxps_avx(auVar77,auVar71);
              auVar67 = vminps_avx(auVar68,auVar67);
              auVar71 = vmaxps_avx(auVar68,auVar71);
              auVar68 = vshufpd_avx(auVar67,auVar67,3);
              auVar77 = vshufpd_avx(auVar71,auVar71,3);
              auVar67 = vminps_avx(auVar67,auVar68);
              auVar71 = vmaxps_avx(auVar71,auVar77);
              fVar123 = auVar82._0_4_;
              auVar206._0_4_ = auVar67._0_4_ * fVar123;
              auVar206._4_4_ = auVar67._4_4_ * fVar123;
              auVar206._8_4_ = auVar67._8_4_ * fVar123;
              auVar206._12_4_ = auVar67._12_4_ * fVar123;
              auVar191._0_4_ = fVar123 * auVar71._0_4_;
              auVar191._4_4_ = fVar123 * auVar71._4_4_;
              auVar191._8_4_ = fVar123 * auVar71._8_4_;
              auVar191._12_4_ = fVar123 * auVar71._12_4_;
              auVar82 = vdivss_avx512f(auVar76,ZEXT416((uint)(auVar168._0_4_ - auVar158._0_4_)));
              auVar71 = vshufpd_avx(auVar78,auVar78,3);
              auVar67 = vshufpd_avx(auVar86,auVar86,3);
              auVar68 = vshufpd_avx(auVar87,auVar87,3);
              auVar77 = vshufpd_avx(auVar81,auVar81,3);
              auVar71 = vsubps_avx(auVar71,auVar78);
              auVar78 = vsubps_avx(auVar67,auVar86);
              auVar86 = vsubps_avx(auVar68,auVar87);
              auVar77 = vsubps_avx(auVar77,auVar81);
              auVar67 = vminps_avx(auVar71,auVar78);
              auVar71 = vmaxps_avx(auVar71,auVar78);
              auVar68 = vminps_avx(auVar86,auVar77);
              auVar68 = vminps_avx(auVar67,auVar68);
              auVar67 = vmaxps_avx(auVar86,auVar77);
              auVar71 = vmaxps_avx(auVar71,auVar67);
              fVar123 = auVar82._0_4_;
              auVar234._0_4_ = fVar123 * auVar68._0_4_;
              auVar234._4_4_ = fVar123 * auVar68._4_4_;
              auVar234._8_4_ = fVar123 * auVar68._8_4_;
              auVar234._12_4_ = fVar123 * auVar68._12_4_;
              auVar222._0_4_ = fVar123 * auVar71._0_4_;
              auVar222._4_4_ = fVar123 * auVar71._4_4_;
              auVar222._8_4_ = fVar123 * auVar71._8_4_;
              auVar222._12_4_ = fVar123 * auVar71._12_4_;
              auVar77 = vinsertps_avx(auVar75,auVar158,0x10);
              auVar79 = vpermt2ps_avx512vl(auVar75,_DAT_01feecd0,auVar168);
              auVar134._0_4_ = auVar77._0_4_ + auVar79._0_4_;
              auVar134._4_4_ = auVar77._4_4_ + auVar79._4_4_;
              auVar134._8_4_ = auVar77._8_4_ + auVar79._8_4_;
              auVar134._12_4_ = auVar77._12_4_ + auVar79._12_4_;
              auVar82 = vmulps_avx512vl(auVar134,auVar128._0_16_);
              auVar67 = vshufps_avx(auVar82,auVar82,0x54);
              uVar132 = auVar82._0_4_;
              auVar136._4_4_ = uVar132;
              auVar136._0_4_ = uVar132;
              auVar136._8_4_ = uVar132;
              auVar136._12_4_ = uVar132;
              auVar86 = vfmadd213ps_avx512vl(auVar65,auVar136,auVar3);
              auVar68 = vfmadd213ps_fma(auVar72,auVar136,local_5f0);
              auVar78 = vfmadd213ps_fma(local_490,auVar136,local_600);
              auVar71 = vsubps_avx(auVar68,auVar86);
              auVar86 = vfmadd213ps_fma(auVar71,auVar136,auVar86);
              auVar71 = vsubps_avx(auVar78,auVar68);
              auVar71 = vfmadd213ps_fma(auVar71,auVar136,auVar68);
              auVar71 = vsubps_avx(auVar71,auVar86);
              auVar68 = vfmadd231ps_fma(auVar86,auVar71,auVar136);
              auVar87 = vmulps_avx512vl(auVar71,auVar85);
              auVar244._8_8_ = auVar68._0_8_;
              auVar244._0_8_ = auVar68._0_8_;
              auVar71 = vshufpd_avx(auVar68,auVar68,3);
              auVar68 = vshufps_avx(auVar82,auVar82,0x55);
              auVar78 = vsubps_avx(auVar71,auVar244);
              auVar86 = vfmadd231ps_fma(auVar244,auVar68,auVar78);
              auVar257._8_8_ = auVar87._0_8_;
              auVar257._0_8_ = auVar87._0_8_;
              auVar71 = vshufpd_avx(auVar87,auVar87,3);
              auVar71 = vsubps_avx512vl(auVar71,auVar257);
              auVar71 = vfmadd213ps_avx512vl(auVar71,auVar68,auVar257);
              auVar137._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar137._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar137._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar68 = vmovshdup_avx512vl(auVar71);
              auVar258._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
              auVar258._8_4_ = auVar68._8_4_ ^ 0x80000000;
              auVar258._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar87 = vmovshdup_avx512vl(auVar78);
              auVar81 = vpermt2ps_avx512vl(auVar258,ZEXT416(5),auVar78);
              auVar68 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar68._0_4_ * auVar78._0_4_)),auVar71,
                                            auVar87);
              auVar78 = vpermt2ps_avx512vl(auVar71,SUB6416(ZEXT464(4),0),auVar137);
              auVar163._0_4_ = auVar68._0_4_;
              auVar163._4_4_ = auVar163._0_4_;
              auVar163._8_4_ = auVar163._0_4_;
              auVar163._12_4_ = auVar163._0_4_;
              auVar71 = vdivps_avx(auVar81,auVar163);
              auVar80 = vdivps_avx512vl(auVar78,auVar163);
              fVar123 = auVar86._0_4_;
              auVar68 = vshufps_avx(auVar86,auVar86,0x55);
              auVar245._0_4_ = fVar123 * auVar71._0_4_ + auVar68._0_4_ * auVar80._0_4_;
              auVar245._4_4_ = fVar123 * auVar71._4_4_ + auVar68._4_4_ * auVar80._4_4_;
              auVar245._8_4_ = fVar123 * auVar71._8_4_ + auVar68._8_4_ * auVar80._8_4_;
              auVar245._12_4_ = fVar123 * auVar71._12_4_ + auVar68._12_4_ * auVar80._12_4_;
              auVar85 = vsubps_avx(auVar67,auVar245);
              auVar68 = vmovshdup_avx(auVar71);
              auVar67 = vinsertps_avx(auVar206,auVar234,0x1c);
              auVar259._0_4_ = auVar68._0_4_ * auVar67._0_4_;
              auVar259._4_4_ = auVar68._4_4_ * auVar67._4_4_;
              auVar259._8_4_ = auVar68._8_4_ * auVar67._8_4_;
              auVar259._12_4_ = auVar68._12_4_ * auVar67._12_4_;
              auVar84 = vinsertps_avx512f(auVar191,auVar222,0x1c);
              auVar68 = vmulps_avx512vl(auVar68,auVar84);
              auVar81 = vminps_avx512vl(auVar259,auVar68);
              auVar86 = vmaxps_avx(auVar68,auVar259);
              auVar87 = vmovshdup_avx(auVar80);
              auVar68 = vinsertps_avx(auVar234,auVar206,0x4c);
              auVar235._0_4_ = auVar87._0_4_ * auVar68._0_4_;
              auVar235._4_4_ = auVar87._4_4_ * auVar68._4_4_;
              auVar235._8_4_ = auVar87._8_4_ * auVar68._8_4_;
              auVar235._12_4_ = auVar87._12_4_ * auVar68._12_4_;
              auVar78 = vinsertps_avx(auVar222,auVar191,0x4c);
              auVar223._0_4_ = auVar87._0_4_ * auVar78._0_4_;
              auVar223._4_4_ = auVar87._4_4_ * auVar78._4_4_;
              auVar223._8_4_ = auVar87._8_4_ * auVar78._8_4_;
              auVar223._12_4_ = auVar87._12_4_ * auVar78._12_4_;
              auVar87 = vminps_avx(auVar235,auVar223);
              auVar81 = vaddps_avx512vl(auVar81,auVar87);
              auVar87 = vmaxps_avx(auVar223,auVar235);
              auVar224._0_4_ = auVar86._0_4_ + auVar87._0_4_;
              auVar224._4_4_ = auVar86._4_4_ + auVar87._4_4_;
              auVar224._8_4_ = auVar86._8_4_ + auVar87._8_4_;
              auVar224._12_4_ = auVar86._12_4_ + auVar87._12_4_;
              auVar236._8_8_ = 0x3f80000000000000;
              auVar236._0_8_ = 0x3f80000000000000;
              auVar86 = vsubps_avx(auVar236,auVar224);
              auVar87 = vsubps_avx(auVar236,auVar81);
              auVar81 = vsubps_avx(auVar77,auVar82);
              auVar82 = vsubps_avx(auVar79,auVar82);
              fVar229 = auVar81._0_4_;
              auVar260._0_4_ = fVar229 * auVar86._0_4_;
              fVar240 = auVar81._4_4_;
              auVar260._4_4_ = fVar240 * auVar86._4_4_;
              fVar241 = auVar81._8_4_;
              auVar260._8_4_ = fVar241 * auVar86._8_4_;
              fVar242 = auVar81._12_4_;
              auVar260._12_4_ = fVar242 * auVar86._12_4_;
              auVar88 = vbroadcastss_avx512vl(auVar71);
              auVar67 = vmulps_avx512vl(auVar88,auVar67);
              auVar84 = vmulps_avx512vl(auVar88,auVar84);
              auVar88 = vminps_avx512vl(auVar67,auVar84);
              auVar84 = vmaxps_avx512vl(auVar84,auVar67);
              auVar67 = vbroadcastss_avx512vl(auVar80);
              auVar68 = vmulps_avx512vl(auVar67,auVar68);
              auVar67 = vmulps_avx512vl(auVar67,auVar78);
              auVar78 = vminps_avx512vl(auVar68,auVar67);
              auVar78 = vaddps_avx512vl(auVar88,auVar78);
              auVar81 = vmulps_avx512vl(auVar81,auVar87);
              fVar123 = auVar82._0_4_;
              auVar225._0_4_ = fVar123 * auVar86._0_4_;
              fVar218 = auVar82._4_4_;
              auVar225._4_4_ = fVar218 * auVar86._4_4_;
              fVar227 = auVar82._8_4_;
              auVar225._8_4_ = fVar227 * auVar86._8_4_;
              fVar228 = auVar82._12_4_;
              auVar225._12_4_ = fVar228 * auVar86._12_4_;
              auVar237._0_4_ = fVar123 * auVar87._0_4_;
              auVar237._4_4_ = fVar218 * auVar87._4_4_;
              auVar237._8_4_ = fVar227 * auVar87._8_4_;
              auVar237._12_4_ = fVar228 * auVar87._12_4_;
              auVar67 = vmaxps_avx(auVar67,auVar68);
              auVar192._0_4_ = auVar84._0_4_ + auVar67._0_4_;
              auVar192._4_4_ = auVar84._4_4_ + auVar67._4_4_;
              auVar192._8_4_ = auVar84._8_4_ + auVar67._8_4_;
              auVar192._12_4_ = auVar84._12_4_ + auVar67._12_4_;
              auVar207._8_8_ = 0x3f800000;
              auVar207._0_8_ = 0x3f800000;
              auVar67 = vsubps_avx(auVar207,auVar192);
              auVar68 = vsubps_avx512vl(auVar207,auVar78);
              auVar254._0_4_ = fVar229 * auVar67._0_4_;
              auVar254._4_4_ = fVar240 * auVar67._4_4_;
              auVar254._8_4_ = fVar241 * auVar67._8_4_;
              auVar254._12_4_ = fVar242 * auVar67._12_4_;
              auVar246._0_4_ = fVar229 * auVar68._0_4_;
              auVar246._4_4_ = fVar240 * auVar68._4_4_;
              auVar246._8_4_ = fVar241 * auVar68._8_4_;
              auVar246._12_4_ = fVar242 * auVar68._12_4_;
              auVar193._0_4_ = fVar123 * auVar67._0_4_;
              auVar193._4_4_ = fVar218 * auVar67._4_4_;
              auVar193._8_4_ = fVar227 * auVar67._8_4_;
              auVar193._12_4_ = fVar228 * auVar67._12_4_;
              auVar208._0_4_ = fVar123 * auVar68._0_4_;
              auVar208._4_4_ = fVar218 * auVar68._4_4_;
              auVar208._8_4_ = fVar227 * auVar68._8_4_;
              auVar208._12_4_ = fVar228 * auVar68._12_4_;
              auVar67 = vminps_avx(auVar254,auVar246);
              auVar68 = vminps_avx512vl(auVar193,auVar208);
              auVar78 = vminps_avx512vl(auVar67,auVar68);
              auVar67 = vmaxps_avx(auVar246,auVar254);
              auVar68 = vmaxps_avx(auVar208,auVar193);
              auVar68 = vmaxps_avx(auVar68,auVar67);
              auVar86 = vminps_avx512vl(auVar260,auVar81);
              auVar67 = vminps_avx(auVar225,auVar237);
              auVar67 = vminps_avx(auVar86,auVar67);
              auVar67 = vhaddps_avx(auVar78,auVar67);
              auVar86 = vmaxps_avx512vl(auVar81,auVar260);
              auVar78 = vmaxps_avx(auVar237,auVar225);
              auVar78 = vmaxps_avx(auVar78,auVar86);
              auVar68 = vhaddps_avx(auVar68,auVar78);
              auVar67 = vshufps_avx(auVar67,auVar67,0xe8);
              auVar68 = vshufps_avx(auVar68,auVar68,0xe8);
              auVar194._0_4_ = auVar67._0_4_ + auVar85._0_4_;
              auVar194._4_4_ = auVar67._4_4_ + auVar85._4_4_;
              auVar194._8_4_ = auVar67._8_4_ + auVar85._8_4_;
              auVar194._12_4_ = auVar67._12_4_ + auVar85._12_4_;
              auVar209._0_4_ = auVar68._0_4_ + auVar85._0_4_;
              auVar209._4_4_ = auVar68._4_4_ + auVar85._4_4_;
              auVar209._8_4_ = auVar68._8_4_ + auVar85._8_4_;
              auVar209._12_4_ = auVar68._12_4_ + auVar85._12_4_;
              auVar67 = vmaxps_avx(auVar77,auVar194);
              auVar68 = vminps_avx(auVar209,auVar79);
              uVar59 = vcmpps_avx512vl(auVar68,auVar67,1);
              if ((uVar59 & 3) == 0) {
                uVar59 = vcmpps_avx512vl(auVar209,auVar79,1);
                uVar23 = vcmpps_avx512vl(auVar75,auVar194,1);
                if (((ushort)uVar23 & (ushort)uVar59 & 1) == 0) {
                  bVar51 = 0;
                }
                else {
                  auVar67 = vmovshdup_avx(auVar194);
                  bVar51 = auVar158._0_4_ < auVar67._0_4_ & (byte)(uVar59 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar53 || uVar7 != 0 && !bVar63) | bVar51) != 1) {
                  auVar67 = vinsertps_avx(auVar158,auVar168,0x10);
                  auVar268 = ZEXT1664(local_610);
                  auVar269 = ZEXT1664(local_620);
                  goto LAB_01cd0d71;
                }
                lVar55 = 200;
                do {
                  auVar75 = vsubss_avx512f(auVar76,auVar85);
                  fVar227 = auVar75._0_4_;
                  fVar123 = fVar227 * fVar227 * fVar227;
                  auVar75 = vmulss_avx512f(auVar85,ZEXT416(0x40400000));
                  fVar218 = auVar75._0_4_ * fVar227 * fVar227;
                  fVar228 = auVar85._0_4_;
                  auVar68 = ZEXT416(0x40400000);
                  auVar75 = vmulss_avx512f(ZEXT416((uint)(fVar228 * fVar228)),auVar68);
                  fVar227 = fVar227 * auVar75._0_4_;
                  auVar151._4_4_ = fVar123;
                  auVar151._0_4_ = fVar123;
                  auVar151._8_4_ = fVar123;
                  auVar151._12_4_ = fVar123;
                  auVar144._4_4_ = fVar218;
                  auVar144._0_4_ = fVar218;
                  auVar144._8_4_ = fVar218;
                  auVar144._12_4_ = fVar218;
                  auVar125._4_4_ = fVar227;
                  auVar125._0_4_ = fVar227;
                  auVar125._8_4_ = fVar227;
                  auVar125._12_4_ = fVar227;
                  fVar228 = fVar228 * fVar228 * fVar228;
                  auVar175._0_4_ = (float)local_480._0_4_ * fVar228;
                  auVar175._4_4_ = (float)local_480._4_4_ * fVar228;
                  auVar175._8_4_ = fStack_478 * fVar228;
                  auVar175._12_4_ = fStack_474 * fVar228;
                  auVar75 = vfmadd231ps_fma(auVar175,local_600,auVar125);
                  auVar75 = vfmadd231ps_fma(auVar75,local_5f0,auVar144);
                  auVar75 = vfmadd231ps_fma(auVar75,auVar3,auVar151);
                  auVar126._8_8_ = auVar75._0_8_;
                  auVar126._0_8_ = auVar75._0_8_;
                  auVar75 = vshufpd_avx(auVar75,auVar75,3);
                  auVar67 = vshufps_avx(auVar85,auVar85,0x55);
                  auVar75 = vsubps_avx(auVar75,auVar126);
                  auVar67 = vfmadd213ps_fma(auVar75,auVar67,auVar126);
                  fVar123 = auVar67._0_4_;
                  auVar75 = vshufps_avx(auVar67,auVar67,0x55);
                  auVar127._0_4_ = auVar71._0_4_ * fVar123 + auVar80._0_4_ * auVar75._0_4_;
                  auVar127._4_4_ = auVar71._4_4_ * fVar123 + auVar80._4_4_ * auVar75._4_4_;
                  auVar127._8_4_ = auVar71._8_4_ * fVar123 + auVar80._8_4_ * auVar75._8_4_;
                  auVar127._12_4_ = auVar71._12_4_ * fVar123 + auVar80._12_4_ * auVar75._12_4_;
                  auVar85 = vsubps_avx(auVar85,auVar127);
                  auVar75 = vandps_avx512vl(auVar67,auVar262._0_16_);
                  auVar67 = vprolq_avx512vl(auVar75,0x20);
                  auVar75 = vmaxss_avx(auVar67,auVar75);
                  bVar63 = (float)local_470._0_4_ < auVar75._0_4_;
                  if (auVar75._0_4_ < (float)local_470._0_4_) {
                    auVar75 = vucomiss_avx512f(auVar83);
                    if (bVar63) break;
                    auVar71 = vucomiss_avx512f(auVar75);
                    auVar270 = ZEXT1664(auVar71);
                    if (bVar63) break;
                    vmovshdup_avx(auVar75);
                    auVar83 = vucomiss_avx512f(auVar83);
                    if (bVar63) break;
                    auVar71 = vucomiss_avx512f(auVar83);
                    auVar270 = ZEXT1664(auVar71);
                    if (bVar63) break;
                    auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar82 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar67 = vdpps_avx(auVar82,local_4a0,0x7f);
                    auVar76 = vdpps_avx(auVar82,local_4b0,0x7f);
                    auVar77 = vdpps_avx(auVar82,local_4c0,0x7f);
                    auVar78 = vdpps_avx(auVar82,local_4d0,0x7f);
                    auVar86 = vdpps_avx(auVar82,local_4e0,0x7f);
                    auVar87 = vdpps_avx(auVar82,local_4f0,0x7f);
                    auVar81 = vdpps_avx(auVar82,local_500,0x7f);
                    auVar82 = vdpps_avx(auVar82,local_510,0x7f);
                    auVar85 = vsubss_avx512f(auVar71,auVar83);
                    fVar229 = auVar83._0_4_;
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar86._0_4_)),auVar85,
                                              auVar67);
                    auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar87._0_4_ * fVar229)),auVar85,
                                              auVar76);
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * fVar229)),auVar85,
                                              auVar77);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar82._0_4_)),auVar85,
                                              auVar78);
                    auVar71 = vsubss_avx512f(auVar71,auVar75);
                    auVar184._0_4_ = auVar71._0_4_;
                    fVar218 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
                    auVar71 = vmulss_avx512f(auVar75,auVar68);
                    fVar227 = auVar71._0_4_ * auVar184._0_4_ * auVar184._0_4_;
                    fVar123 = auVar75._0_4_;
                    auVar176._0_4_ = fVar123 * fVar123;
                    auVar176._4_4_ = auVar75._4_4_ * auVar75._4_4_;
                    auVar176._8_4_ = auVar75._8_4_ * auVar75._8_4_;
                    auVar176._12_4_ = auVar75._12_4_ * auVar75._12_4_;
                    auVar71 = vmulss_avx512f(auVar176,auVar68);
                    fVar228 = auVar184._0_4_ * auVar71._0_4_;
                    fVar241 = fVar123 * auVar176._0_4_;
                    auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * auVar77._0_4_)),
                                              ZEXT416((uint)fVar228),auVar76);
                    auVar71 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar227),auVar67);
                    auVar83 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar218),auVar83);
                    fVar240 = auVar83._0_4_;
                    if ((fVar240 < fVar141) ||
                       (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar242 < fVar240)) break;
                    auVar83 = vshufps_avx(auVar75,auVar75,0x55);
                    auVar68 = vsubps_avx512vl(auVar70,auVar83);
                    fVar243 = auVar83._0_4_;
                    auVar214._0_4_ = fVar243 * (float)local_530._0_4_;
                    fVar248 = auVar83._4_4_;
                    auVar214._4_4_ = fVar248 * (float)local_530._4_4_;
                    fVar249 = auVar83._8_4_;
                    auVar214._8_4_ = fVar249 * fStack_528;
                    fVar250 = auVar83._12_4_;
                    auVar214._12_4_ = fVar250 * fStack_524;
                    auVar226._0_4_ = fVar243 * (float)local_580._0_4_;
                    auVar226._4_4_ = fVar248 * (float)local_580._4_4_;
                    auVar226._8_4_ = fVar249 * fStack_578;
                    auVar226._12_4_ = fVar250 * fStack_574;
                    auVar238._0_4_ = fVar243 * (float)local_590._0_4_;
                    auVar238._4_4_ = fVar248 * (float)local_590._4_4_;
                    auVar238._8_4_ = fVar249 * fStack_588;
                    auVar238._12_4_ = fVar250 * fStack_584;
                    auVar195._0_4_ = fVar243 * (float)local_550._0_4_;
                    auVar195._4_4_ = fVar248 * (float)local_550._4_4_;
                    auVar195._8_4_ = fVar249 * fStack_548;
                    auVar195._12_4_ = fVar250 * fStack_544;
                    auVar83 = vfmadd231ps_fma(auVar214,auVar68,local_520);
                    auVar71 = vfmadd231ps_fma(auVar226,auVar68,local_560);
                    auVar67 = vfmadd231ps_fma(auVar238,auVar68,local_570);
                    auVar68 = vfmadd231ps_fma(auVar195,auVar68,local_540);
                    auVar83 = vsubps_avx(auVar71,auVar83);
                    auVar71 = vsubps_avx(auVar67,auVar71);
                    auVar67 = vsubps_avx(auVar68,auVar67);
                    auVar239._0_4_ = fVar123 * auVar71._0_4_;
                    auVar239._4_4_ = fVar123 * auVar71._4_4_;
                    auVar239._8_4_ = fVar123 * auVar71._8_4_;
                    auVar239._12_4_ = fVar123 * auVar71._12_4_;
                    auVar184._4_4_ = auVar184._0_4_;
                    auVar184._8_4_ = auVar184._0_4_;
                    auVar184._12_4_ = auVar184._0_4_;
                    auVar83 = vfmadd231ps_fma(auVar239,auVar184,auVar83);
                    auVar196._0_4_ = fVar123 * auVar67._0_4_;
                    auVar196._4_4_ = fVar123 * auVar67._4_4_;
                    auVar196._8_4_ = fVar123 * auVar67._8_4_;
                    auVar196._12_4_ = fVar123 * auVar67._12_4_;
                    auVar71 = vfmadd231ps_fma(auVar196,auVar184,auVar71);
                    auVar197._0_4_ = fVar123 * auVar71._0_4_;
                    auVar197._4_4_ = fVar123 * auVar71._4_4_;
                    auVar197._8_4_ = fVar123 * auVar71._8_4_;
                    auVar197._12_4_ = fVar123 * auVar71._12_4_;
                    auVar83 = vfmadd231ps_fma(auVar197,auVar184,auVar83);
                    auVar27._8_4_ = 0x40400000;
                    auVar27._0_8_ = 0x4040000040400000;
                    auVar27._12_4_ = 0x40400000;
                    auVar83 = vmulps_avx512vl(auVar83,auVar27);
                    pGVar8 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar177._0_4_ = fVar241 * (float)local_5d0._0_4_;
                    auVar177._4_4_ = fVar241 * (float)local_5d0._4_4_;
                    auVar177._8_4_ = fVar241 * fStack_5c8;
                    auVar177._12_4_ = fVar241 * fStack_5c4;
                    auVar164._4_4_ = fVar228;
                    auVar164._0_4_ = fVar228;
                    auVar164._8_4_ = fVar228;
                    auVar164._12_4_ = fVar228;
                    auVar71 = vfmadd132ps_fma(auVar164,auVar177,local_5c0);
                    auVar152._4_4_ = fVar227;
                    auVar152._0_4_ = fVar227;
                    auVar152._8_4_ = fVar227;
                    auVar152._12_4_ = fVar227;
                    auVar71 = vfmadd132ps_fma(auVar152,auVar71,local_5b0);
                    auVar145._4_4_ = fVar218;
                    auVar145._0_4_ = fVar218;
                    auVar145._8_4_ = fVar218;
                    auVar145._12_4_ = fVar218;
                    auVar68 = vfmadd132ps_fma(auVar145,auVar71,local_5a0);
                    auVar71 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar67 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar146._0_4_ = auVar68._0_4_ * auVar67._0_4_;
                    auVar146._4_4_ = auVar68._4_4_ * auVar67._4_4_;
                    auVar146._8_4_ = auVar68._8_4_ * auVar67._8_4_;
                    auVar146._12_4_ = auVar68._12_4_ * auVar67._12_4_;
                    auVar83 = vfmsub231ps_fma(auVar146,auVar83,auVar71);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar240;
                      uVar132 = vextractps_avx(auVar83,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar132;
                      uVar132 = vextractps_avx(auVar83,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar132;
                      *(int *)(ray + k * 4 + 0x380) = auVar83._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar123;
                      *(float *)(ray + k * 4 + 0x400) = fVar229;
                      *(uint *)(ray + k * 4 + 0x440) = uVar6;
                      *(uint *)(ray + k * 4 + 0x480) = uVar60;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar75);
                    auVar121 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar121,ZEXT1664(auVar75));
                    auVar121 = vpermps_avx512f(auVar121,ZEXT1664(auVar83));
                    auVar268 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar268,ZEXT1664(auVar83));
                    local_240 = vbroadcastss_avx512f(auVar83);
                    local_2c0[0] = (RTCHitN)auVar121[0];
                    local_2c0[1] = (RTCHitN)auVar121[1];
                    local_2c0[2] = (RTCHitN)auVar121[2];
                    local_2c0[3] = (RTCHitN)auVar121[3];
                    local_2c0[4] = (RTCHitN)auVar121[4];
                    local_2c0[5] = (RTCHitN)auVar121[5];
                    local_2c0[6] = (RTCHitN)auVar121[6];
                    local_2c0[7] = (RTCHitN)auVar121[7];
                    local_2c0[8] = (RTCHitN)auVar121[8];
                    local_2c0[9] = (RTCHitN)auVar121[9];
                    local_2c0[10] = (RTCHitN)auVar121[10];
                    local_2c0[0xb] = (RTCHitN)auVar121[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar121[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar121[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar121[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar121[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar121[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar121[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar121[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar121[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar121[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar121[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar121[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar121[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar121[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar121[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar121[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar121[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar121[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar121[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar121[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar121[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar121[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar121[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar121[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar121[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar121[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar121[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar121[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar121[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar121[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar121[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar121[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar121[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar121[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar121[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar121[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar121[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar121[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar121[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar121[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar121[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar121[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar121[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar121[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar121[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar121[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar121[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar121[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar121[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar121[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar121[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar121[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar121[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar121 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar121);
                    vpcmpeqd_avx2(auVar121._0_32_,auVar121._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar240;
                    auVar121 = vmovdqa64_avx512f(local_380);
                    local_400 = vmovdqa64_avx512f(auVar121);
                    local_650.valid = (int *)local_400;
                    local_650.geometryUserPtr = pGVar8->userPtr;
                    local_650.context = context->user;
                    local_650.hit = local_2c0;
                    local_650.N = 0x10;
                    local_650.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_650);
                      auVar270 = ZEXT464(0x3f800000);
                      auVar267 = ZEXT3264(_DAT_01feed20);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar266 = ZEXT1664(auVar75);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar265 = ZEXT1664(auVar75);
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar264 = ZEXT3264(auVar94);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar263 = ZEXT1664(auVar75);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar262 = ZEXT1664(auVar75);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar128 = ZEXT1664(auVar75);
                      auVar121 = vmovdqa64_avx512f(local_400);
                    }
                    auVar111._16_48_ = auVar121._16_48_;
                    uVar23 = vptestmd_avx512f(auVar121,auVar121);
                    if ((short)uVar23 != 0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_650);
                        auVar270 = ZEXT464(0x3f800000);
                        auVar267 = ZEXT3264(_DAT_01feed20);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar266 = ZEXT1664(auVar75);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar265 = ZEXT1664(auVar75);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar264 = ZEXT3264(auVar94);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar263 = ZEXT1664(auVar75);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar262 = ZEXT1664(auVar75);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar128 = ZEXT1664(auVar75);
                        auVar121 = vmovdqa64_avx512f(local_400);
                        auVar111._16_48_ = auVar121._16_48_;
                      }
                      uVar59 = vptestmd_avx512f(auVar121,auVar121);
                      if ((short)uVar59 != 0) {
                        iVar36 = *(int *)(local_650.hit + 4);
                        iVar37 = *(int *)(local_650.hit + 8);
                        iVar38 = *(int *)(local_650.hit + 0xc);
                        iVar39 = *(int *)(local_650.hit + 0x10);
                        iVar40 = *(int *)(local_650.hit + 0x14);
                        iVar41 = *(int *)(local_650.hit + 0x18);
                        iVar42 = *(int *)(local_650.hit + 0x1c);
                        iVar43 = *(int *)(local_650.hit + 0x20);
                        iVar44 = *(int *)(local_650.hit + 0x24);
                        iVar45 = *(int *)(local_650.hit + 0x28);
                        iVar46 = *(int *)(local_650.hit + 0x2c);
                        iVar47 = *(int *)(local_650.hit + 0x30);
                        iVar48 = *(int *)(local_650.hit + 0x34);
                        iVar49 = *(int *)(local_650.hit + 0x38);
                        iVar50 = *(int *)(local_650.hit + 0x3c);
                        bVar51 = (byte)uVar59;
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                        bVar15 = (byte)(uVar59 >> 8);
                        bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        bVar22 = SUB81(uVar59 >> 0xf,0);
                        *(uint *)(local_650.ray + 0x300) =
                             (uint)(bVar51 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar51 & 1) * *(int *)(local_650.ray + 0x300);
                        *(uint *)(local_650.ray + 0x304) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_650.ray + 0x304)
                        ;
                        *(uint *)(local_650.ray + 0x308) =
                             (uint)bVar64 * iVar37 | (uint)!bVar64 * *(int *)(local_650.ray + 0x308)
                        ;
                        *(uint *)(local_650.ray + 0x30c) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_650.ray + 0x30c)
                        ;
                        *(uint *)(local_650.ray + 0x310) =
                             (uint)bVar62 * iVar39 | (uint)!bVar62 * *(int *)(local_650.ray + 0x310)
                        ;
                        *(uint *)(local_650.ray + 0x314) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_650.ray + 0x314)
                        ;
                        *(uint *)(local_650.ray + 0x318) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_650.ray + 0x318)
                        ;
                        *(uint *)(local_650.ray + 0x31c) =
                             (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_650.ray + 0x31c)
                        ;
                        *(uint *)(local_650.ray + 800) =
                             (uint)(bVar15 & 1) * iVar43 |
                             (uint)!(bool)(bVar15 & 1) * *(int *)(local_650.ray + 800);
                        *(uint *)(local_650.ray + 0x324) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_650.ray + 0x324)
                        ;
                        *(uint *)(local_650.ray + 0x328) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_650.ray + 0x328)
                        ;
                        *(uint *)(local_650.ray + 0x32c) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_650.ray + 0x32c)
                        ;
                        *(uint *)(local_650.ray + 0x330) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_650.ray + 0x330)
                        ;
                        *(uint *)(local_650.ray + 0x334) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_650.ray + 0x334)
                        ;
                        *(uint *)(local_650.ray + 0x338) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_650.ray + 0x338)
                        ;
                        *(uint *)(local_650.ray + 0x33c) =
                             (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_650.ray + 0x33c)
                        ;
                        iVar36 = *(int *)(local_650.hit + 0x44);
                        iVar37 = *(int *)(local_650.hit + 0x48);
                        iVar38 = *(int *)(local_650.hit + 0x4c);
                        iVar39 = *(int *)(local_650.hit + 0x50);
                        iVar40 = *(int *)(local_650.hit + 0x54);
                        iVar41 = *(int *)(local_650.hit + 0x58);
                        iVar42 = *(int *)(local_650.hit + 0x5c);
                        iVar43 = *(int *)(local_650.hit + 0x60);
                        iVar44 = *(int *)(local_650.hit + 100);
                        iVar45 = *(int *)(local_650.hit + 0x68);
                        iVar46 = *(int *)(local_650.hit + 0x6c);
                        iVar47 = *(int *)(local_650.hit + 0x70);
                        iVar48 = *(int *)(local_650.hit + 0x74);
                        iVar49 = *(int *)(local_650.hit + 0x78);
                        iVar50 = *(int *)(local_650.hit + 0x7c);
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        bVar22 = SUB81(uVar59 >> 0xf,0);
                        *(uint *)(local_650.ray + 0x340) =
                             (uint)(bVar51 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar51 & 1) * *(int *)(local_650.ray + 0x340);
                        *(uint *)(local_650.ray + 0x344) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_650.ray + 0x344)
                        ;
                        *(uint *)(local_650.ray + 0x348) =
                             (uint)bVar64 * iVar37 | (uint)!bVar64 * *(int *)(local_650.ray + 0x348)
                        ;
                        *(uint *)(local_650.ray + 0x34c) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_650.ray + 0x34c)
                        ;
                        *(uint *)(local_650.ray + 0x350) =
                             (uint)bVar62 * iVar39 | (uint)!bVar62 * *(int *)(local_650.ray + 0x350)
                        ;
                        *(uint *)(local_650.ray + 0x354) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_650.ray + 0x354)
                        ;
                        *(uint *)(local_650.ray + 0x358) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_650.ray + 0x358)
                        ;
                        *(uint *)(local_650.ray + 0x35c) =
                             (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_650.ray + 0x35c)
                        ;
                        *(uint *)(local_650.ray + 0x360) =
                             (uint)(bVar15 & 1) * iVar43 |
                             (uint)!(bool)(bVar15 & 1) * *(int *)(local_650.ray + 0x360);
                        *(uint *)(local_650.ray + 0x364) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_650.ray + 0x364)
                        ;
                        *(uint *)(local_650.ray + 0x368) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_650.ray + 0x368)
                        ;
                        *(uint *)(local_650.ray + 0x36c) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_650.ray + 0x36c)
                        ;
                        *(uint *)(local_650.ray + 0x370) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_650.ray + 0x370)
                        ;
                        *(uint *)(local_650.ray + 0x374) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_650.ray + 0x374)
                        ;
                        *(uint *)(local_650.ray + 0x378) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_650.ray + 0x378)
                        ;
                        *(uint *)(local_650.ray + 0x37c) =
                             (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_650.ray + 0x37c)
                        ;
                        iVar36 = *(int *)(local_650.hit + 0x84);
                        iVar37 = *(int *)(local_650.hit + 0x88);
                        iVar38 = *(int *)(local_650.hit + 0x8c);
                        iVar39 = *(int *)(local_650.hit + 0x90);
                        iVar40 = *(int *)(local_650.hit + 0x94);
                        iVar41 = *(int *)(local_650.hit + 0x98);
                        iVar42 = *(int *)(local_650.hit + 0x9c);
                        iVar43 = *(int *)(local_650.hit + 0xa0);
                        iVar44 = *(int *)(local_650.hit + 0xa4);
                        iVar45 = *(int *)(local_650.hit + 0xa8);
                        iVar46 = *(int *)(local_650.hit + 0xac);
                        iVar47 = *(int *)(local_650.hit + 0xb0);
                        iVar48 = *(int *)(local_650.hit + 0xb4);
                        iVar49 = *(int *)(local_650.hit + 0xb8);
                        iVar50 = *(int *)(local_650.hit + 0xbc);
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        bVar22 = SUB81(uVar59 >> 0xf,0);
                        *(uint *)(local_650.ray + 0x380) =
                             (uint)(bVar51 & 1) * *(int *)(local_650.hit + 0x80) |
                             (uint)!(bool)(bVar51 & 1) * *(int *)(local_650.ray + 0x380);
                        *(uint *)(local_650.ray + 900) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_650.ray + 900);
                        *(uint *)(local_650.ray + 0x388) =
                             (uint)bVar64 * iVar37 | (uint)!bVar64 * *(int *)(local_650.ray + 0x388)
                        ;
                        *(uint *)(local_650.ray + 0x38c) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_650.ray + 0x38c)
                        ;
                        *(uint *)(local_650.ray + 0x390) =
                             (uint)bVar62 * iVar39 | (uint)!bVar62 * *(int *)(local_650.ray + 0x390)
                        ;
                        *(uint *)(local_650.ray + 0x394) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_650.ray + 0x394)
                        ;
                        *(uint *)(local_650.ray + 0x398) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_650.ray + 0x398)
                        ;
                        *(uint *)(local_650.ray + 0x39c) =
                             (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_650.ray + 0x39c)
                        ;
                        *(uint *)(local_650.ray + 0x3a0) =
                             (uint)(bVar15 & 1) * iVar43 |
                             (uint)!(bool)(bVar15 & 1) * *(int *)(local_650.ray + 0x3a0);
                        *(uint *)(local_650.ray + 0x3a4) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_650.ray + 0x3a4)
                        ;
                        *(uint *)(local_650.ray + 0x3a8) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_650.ray + 0x3a8)
                        ;
                        *(uint *)(local_650.ray + 0x3ac) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_650.ray + 0x3ac)
                        ;
                        *(uint *)(local_650.ray + 0x3b0) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_650.ray + 0x3b0)
                        ;
                        *(uint *)(local_650.ray + 0x3b4) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_650.ray + 0x3b4)
                        ;
                        *(uint *)(local_650.ray + 0x3b8) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_650.ray + 0x3b8)
                        ;
                        *(uint *)(local_650.ray + 0x3bc) =
                             (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_650.ray + 0x3bc)
                        ;
                        iVar36 = *(int *)(local_650.hit + 0xc4);
                        iVar37 = *(int *)(local_650.hit + 200);
                        iVar38 = *(int *)(local_650.hit + 0xcc);
                        iVar39 = *(int *)(local_650.hit + 0xd0);
                        iVar40 = *(int *)(local_650.hit + 0xd4);
                        iVar41 = *(int *)(local_650.hit + 0xd8);
                        iVar42 = *(int *)(local_650.hit + 0xdc);
                        iVar43 = *(int *)(local_650.hit + 0xe0);
                        iVar44 = *(int *)(local_650.hit + 0xe4);
                        iVar45 = *(int *)(local_650.hit + 0xe8);
                        iVar46 = *(int *)(local_650.hit + 0xec);
                        iVar47 = *(int *)(local_650.hit + 0xf0);
                        iVar48 = *(int *)(local_650.hit + 0xf4);
                        iVar49 = *(int *)(local_650.hit + 0xf8);
                        iVar50 = *(int *)(local_650.hit + 0xfc);
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        bVar22 = SUB81(uVar59 >> 0xf,0);
                        *(uint *)(local_650.ray + 0x3c0) =
                             (uint)(bVar51 & 1) * *(int *)(local_650.hit + 0xc0) |
                             (uint)!(bool)(bVar51 & 1) * *(int *)(local_650.ray + 0x3c0);
                        *(uint *)(local_650.ray + 0x3c4) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_650.ray + 0x3c4)
                        ;
                        *(uint *)(local_650.ray + 0x3c8) =
                             (uint)bVar64 * iVar37 | (uint)!bVar64 * *(int *)(local_650.ray + 0x3c8)
                        ;
                        *(uint *)(local_650.ray + 0x3cc) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_650.ray + 0x3cc)
                        ;
                        *(uint *)(local_650.ray + 0x3d0) =
                             (uint)bVar62 * iVar39 | (uint)!bVar62 * *(int *)(local_650.ray + 0x3d0)
                        ;
                        *(uint *)(local_650.ray + 0x3d4) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_650.ray + 0x3d4)
                        ;
                        *(uint *)(local_650.ray + 0x3d8) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_650.ray + 0x3d8)
                        ;
                        *(uint *)(local_650.ray + 0x3dc) =
                             (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_650.ray + 0x3dc)
                        ;
                        *(uint *)(local_650.ray + 0x3e0) =
                             (uint)(bVar15 & 1) * iVar43 |
                             (uint)!(bool)(bVar15 & 1) * *(int *)(local_650.ray + 0x3e0);
                        *(uint *)(local_650.ray + 0x3e4) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_650.ray + 0x3e4)
                        ;
                        *(uint *)(local_650.ray + 1000) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_650.ray + 1000);
                        *(uint *)(local_650.ray + 0x3ec) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_650.ray + 0x3ec)
                        ;
                        *(uint *)(local_650.ray + 0x3f0) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_650.ray + 0x3f0)
                        ;
                        *(uint *)(local_650.ray + 0x3f4) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_650.ray + 0x3f4)
                        ;
                        *(uint *)(local_650.ray + 0x3f8) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_650.ray + 0x3f8)
                        ;
                        *(uint *)(local_650.ray + 0x3fc) =
                             (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_650.ray + 0x3fc)
                        ;
                        iVar36 = *(int *)(local_650.hit + 0x104);
                        iVar37 = *(int *)(local_650.hit + 0x108);
                        iVar38 = *(int *)(local_650.hit + 0x10c);
                        iVar39 = *(int *)(local_650.hit + 0x110);
                        iVar40 = *(int *)(local_650.hit + 0x114);
                        iVar41 = *(int *)(local_650.hit + 0x118);
                        iVar42 = *(int *)(local_650.hit + 0x11c);
                        iVar43 = *(int *)(local_650.hit + 0x120);
                        iVar44 = *(int *)(local_650.hit + 0x124);
                        iVar45 = *(int *)(local_650.hit + 0x128);
                        iVar46 = *(int *)(local_650.hit + 300);
                        iVar47 = *(int *)(local_650.hit + 0x130);
                        iVar48 = *(int *)(local_650.hit + 0x134);
                        iVar49 = *(int *)(local_650.hit + 0x138);
                        iVar50 = *(int *)(local_650.hit + 0x13c);
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
                        bVar61 = (bool)((byte)(uVar59 >> 3) & 1);
                        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        bVar22 = SUB81(uVar59 >> 0xf,0);
                        *(uint *)(local_650.ray + 0x400) =
                             (uint)(bVar51 & 1) * *(int *)(local_650.hit + 0x100) |
                             (uint)!(bool)(bVar51 & 1) * *(int *)(local_650.ray + 0x400);
                        *(uint *)(local_650.ray + 0x404) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_650.ray + 0x404)
                        ;
                        *(uint *)(local_650.ray + 0x408) =
                             (uint)bVar64 * iVar37 | (uint)!bVar64 * *(int *)(local_650.ray + 0x408)
                        ;
                        *(uint *)(local_650.ray + 0x40c) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_650.ray + 0x40c)
                        ;
                        *(uint *)(local_650.ray + 0x410) =
                             (uint)bVar62 * iVar39 | (uint)!bVar62 * *(int *)(local_650.ray + 0x410)
                        ;
                        *(uint *)(local_650.ray + 0x414) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_650.ray + 0x414)
                        ;
                        *(uint *)(local_650.ray + 0x418) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_650.ray + 0x418)
                        ;
                        *(uint *)(local_650.ray + 0x41c) =
                             (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_650.ray + 0x41c)
                        ;
                        *(uint *)(local_650.ray + 0x420) =
                             (uint)(bVar15 & 1) * iVar43 |
                             (uint)!(bool)(bVar15 & 1) * *(int *)(local_650.ray + 0x420);
                        *(uint *)(local_650.ray + 0x424) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_650.ray + 0x424)
                        ;
                        *(uint *)(local_650.ray + 0x428) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_650.ray + 0x428)
                        ;
                        *(uint *)(local_650.ray + 0x42c) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_650.ray + 0x42c)
                        ;
                        *(uint *)(local_650.ray + 0x430) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_650.ray + 0x430)
                        ;
                        *(uint *)(local_650.ray + 0x434) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_650.ray + 0x434)
                        ;
                        *(uint *)(local_650.ray + 0x438) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_650.ray + 0x438)
                        ;
                        *(uint *)(local_650.ray + 0x43c) =
                             (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_650.ray + 0x43c)
                        ;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_650.hit + 0x140));
                        auVar121 = vmovdqu32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_650.ray + 0x440) = auVar121;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_650.hit + 0x180));
                        auVar121 = vmovdqu32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_650.ray + 0x480) = auVar121;
                        auVar268 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_650.hit + 0x1c0));
                        auVar121 = vmovdqa32_avx512f(auVar268);
                        *(undefined1 (*) [64])(local_650.ray + 0x4c0) = auVar121;
                        auVar121 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_650.hit + 0x200));
                        bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
                        auVar35._4_56_ = auVar121._8_56_;
                        auVar35._0_4_ =
                             (uint)bVar63 * auVar121._4_4_ | (uint)!bVar63 * auVar268._4_4_;
                        auVar122._0_8_ = auVar35._0_8_ << 0x20;
                        bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                        auVar122._8_4_ =
                             (uint)bVar63 * auVar121._8_4_ | (uint)!bVar63 * auVar268._8_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
                        auVar122._12_4_ =
                             (uint)bVar63 * auVar121._12_4_ | (uint)!bVar63 * auVar268._12_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 4) & 1);
                        auVar122._16_4_ =
                             (uint)bVar63 * auVar121._16_4_ | (uint)!bVar63 * auVar268._16_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 5) & 1);
                        auVar122._20_4_ =
                             (uint)bVar63 * auVar121._20_4_ | (uint)!bVar63 * auVar268._20_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 6) & 1);
                        auVar122._24_4_ =
                             (uint)bVar63 * auVar121._24_4_ | (uint)!bVar63 * auVar268._24_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 7) & 1);
                        auVar122._28_4_ =
                             (uint)bVar63 * auVar121._28_4_ | (uint)!bVar63 * auVar268._28_4_;
                        auVar122._32_4_ =
                             (uint)(bVar15 & 1) * auVar121._32_4_ |
                             (uint)!(bool)(bVar15 & 1) * auVar268._32_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 9) & 1);
                        auVar122._36_4_ =
                             (uint)bVar63 * auVar121._36_4_ | (uint)!bVar63 * auVar268._36_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 10) & 1);
                        auVar122._40_4_ =
                             (uint)bVar63 * auVar121._40_4_ | (uint)!bVar63 * auVar268._40_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 0xb) & 1);
                        auVar122._44_4_ =
                             (uint)bVar63 * auVar121._44_4_ | (uint)!bVar63 * auVar268._44_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 0xc) & 1);
                        auVar122._48_4_ =
                             (uint)bVar63 * auVar121._48_4_ | (uint)!bVar63 * auVar268._48_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 0xd) & 1);
                        auVar122._52_4_ =
                             (uint)bVar63 * auVar121._52_4_ | (uint)!bVar63 * auVar268._52_4_;
                        bVar63 = (bool)((byte)(uVar59 >> 0xe) & 1);
                        auVar122._56_4_ =
                             (uint)bVar63 * auVar121._56_4_ | (uint)!bVar63 * auVar268._56_4_;
                        bVar63 = SUB81(uVar59 >> 0xf,0);
                        auVar122._60_4_ =
                             (uint)bVar63 * auVar121._60_4_ | (uint)!bVar63 * auVar268._60_4_;
                        auVar111._16_48_ = auVar122._16_48_;
                        auVar121 = vmovdqa32_avx512f(auVar121);
                        *(undefined1 (*) [64])(local_650.ray + 0x500) = auVar121;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar242;
                    break;
                  }
                  lVar55 = lVar55 + -1;
                } while (lVar55 != 0);
              }
            }
          }
          auVar268 = ZEXT1664(local_610);
          auVar269 = ZEXT1664(local_620);
          if ((uint)uVar53 == 0) break;
        } while( true );
      }
      uVar132 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar28._4_4_ = uVar132;
      auVar28._0_4_ = uVar132;
      auVar28._8_4_ = uVar132;
      auVar28._12_4_ = uVar132;
      auVar28._16_4_ = uVar132;
      auVar28._20_4_ = uVar132;
      auVar28._24_4_ = uVar132;
      auVar28._28_4_ = uVar132;
      uVar23 = vcmpps_avx512vl(local_3c0,auVar28,2);
      uVar60 = (uint)uVar58 & (uint)uVar23;
      uVar58 = (ulong)uVar60;
    } while (uVar60 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }